

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O3

void av1_warp_affine_sse4_1
               (int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,int16_t delta)

{
  int iVar1;
  int8_t aiVar2 [8];
  int8_t aiVar3 [8];
  int8_t aiVar4 [8];
  ulong uVar5;
  WarpedFilterCoeff aWVar6 [8];
  WarpedFilterCoeff aWVar7 [8];
  WarpedFilterCoeff aWVar8 [8];
  uint uVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [12];
  byte bVar16;
  int iVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  byte bVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  undefined2 *puVar54;
  uint uVar55;
  uint uVar56;
  long lVar57;
  undefined1 (*pauVar58) [16];
  int iVar59;
  int iVar60;
  int iVar61;
  ulong uVar62;
  long lVar63;
  int iVar64;
  int iVar65;
  uint uVar66;
  int iVar67;
  ushort *puVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  long lVar72;
  uint uVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  uint uVar77;
  int iVar78;
  long lVar79;
  int iVar80;
  ulong uVar81;
  undefined4 uVar82;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined4 uVar83;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  short sVar152;
  short sVar155;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  short sVar187;
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar198 [16];
  int iVar234;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar205 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined4 uVar235;
  undefined1 in_XMM4 [16];
  undefined1 auVar237 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar261 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar263 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar271 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar291 [16];
  undefined1 auVar295 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  int iVar320;
  int iVar321;
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  int iVar322;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  int iVar340;
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  int iVar341;
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar360 [16];
  __m128i tmp [15];
  byte local_32c;
  int local_328;
  int local_314;
  uint local_310;
  int *local_2e8;
  short local_2d8;
  short sStack_2d6;
  WarpedFilterCoeff WStack_2d4;
  WarpedFilterCoeff WStack_2d2;
  undefined2 uStack_2d0;
  undefined2 uStack_2ce;
  undefined2 uStack_2cc;
  undefined2 uStack_2ca;
  short local_188;
  short sStack_186;
  undefined8 uStack_150;
  undefined8 uStack_140;
  ushort local_128 [2];
  undefined4 uStack_124;
  ushort auStack_120 [2];
  undefined4 uStack_11c;
  undefined2 local_118 [16];
  undefined2 local_f8 [16];
  undefined2 local_d8 [16];
  undefined2 local_b8 [68];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar116 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar177 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar228 [16];
  undefined1 auVar190 [16];
  undefined1 auVar195 [16];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  undefined1 auVar213 [16];
  undefined1 auVar221 [16];
  undefined1 auVar191 [16];
  undefined1 auVar196 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar214 [16];
  undefined1 auVar222 [16];
  undefined1 auVar192 [16];
  undefined1 auVar197 [16];
  undefined1 auVar204 [16];
  undefined1 auVar208 [16];
  undefined1 auVar215 [16];
  undefined1 auVar223 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar236 [16];
  undefined1 auVar257 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar262 [16];
  undefined1 auVar270 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar278 [16];
  undefined1 auVar283 [16];
  undefined1 auVar288 [16];
  undefined1 auVar292 [16];
  undefined1 auVar279 [16];
  undefined1 auVar284 [16];
  undefined1 auVar289 [16];
  undefined1 auVar293 [16];
  undefined1 auVar280 [16];
  undefined1 auVar285 [16];
  undefined1 auVar290 [16];
  undefined1 auVar294 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar352 [16];
  undefined1 auVar357 [16];
  undefined1 auVar353 [16];
  undefined1 auVar358 [16];
  undefined1 auVar354 [16];
  undefined1 auVar359 [16];
  
  uVar9 = conv_params->round_0;
  bVar47 = (byte)uVar9;
  if (conv_params->is_compound == 0) {
    uVar73 = 0xe - uVar9;
    local_32c = 0x16 - bVar47;
    iVar48 = (1 << ((byte)uVar73 & 0x1f)) >> 1;
    local_310 = 0xe - (conv_params->round_1 + uVar9);
  }
  else {
    uVar73 = conv_params->round_1;
    local_32c = 0x16 - bVar47;
    iVar48 = (1 << ((byte)uVar73 & 0x1f)) >> 1;
    local_310 = (0xe - uVar9) - uVar73;
    if (conv_params->is_compound == 1) {
      iVar48 = iVar48 + (1 << (local_32c & 0x1f));
      goto LAB_0040f0a8;
    }
  }
  iVar48 = (-1 << ((char)uVar73 + 7U & 0x1f)) + iVar48;
LAB_0040f0a8:
  local_2e8 = &conv_params->round_1;
  if (0 < p_height) {
    iVar74 = (int)alpha;
    iVar64 = (int)beta;
    iVar80 = (int)gamma;
    iVar76 = (int)delta;
    iVar59 = 1 << (0xe - bVar47 & 0x1f);
    auVar84 = ZEXT416(((uint)(1 << (bVar47 & 0x1f)) >> 1) + 0x4000);
    iVar71 = iVar64 * -3 + 0x10200;
    auVar85 = pshuflw(auVar84,auVar84,0);
    iVar1 = height + -1;
    lVar72 = (long)height;
    uVar49 = (uint)(1 << ((byte)local_310 & 0x1f)) >> 1;
    iVar17 = iVar74 * 2;
    local_314 = 0;
    iVar61 = 0;
    auVar84 = auVar85;
    auVar91 = _DAT_00563870;
    auVar92 = _DAT_00563880;
    uVar56 = p_height;
    do {
      uVar62 = (ulong)uVar56;
      if (7 < uVar62) {
        uVar62 = 8;
      }
      lVar57 = (long)(int)uVar56;
      if (7 < lVar57) {
        lVar57 = 8;
      }
      if (0 < p_width) {
        lVar57 = lVar57 + 7;
        iVar65 = p_height - iVar61;
        iVar75 = 8;
        if (iVar65 < 8) {
          iVar75 = iVar65;
        }
        lVar51 = (long)(p_row + 4 + iVar61 << ((byte)subsampling_y & 0x1f));
        lVar52 = (long)iVar75;
        iVar75 = 0;
        local_328 = local_314;
        do {
          lVar53 = (long)(p_col + 4 + iVar75 << ((byte)subsampling_x & 0x1f));
          lVar79 = (long)*mat + mat[3] * lVar51 + mat[2] * lVar53 >> ((byte)subsampling_x & 0x3f);
          lVar53 = (long)mat[1] + mat[5] * lVar51 + mat[4] * lVar53 >> ((byte)subsampling_y & 0x3f);
          uVar55 = (uint)((ulong)lVar79 >> 0x10);
          iVar78 = (int)((ulong)lVar53 >> 0x10);
          if ((int)uVar55 < -6) {
            if (-7 < iVar65) {
              lVar79 = -7;
              puVar68 = local_128;
              do {
                iVar50 = iVar78 + (int)lVar79;
                if (lVar72 <= iVar78 + lVar79) {
                  iVar50 = iVar1;
                }
                if (iVar78 + lVar79 < 0) {
                  iVar50 = 0;
                }
                auVar84 = ZEXT416(((uint)ref[iVar50 * stride] << (7 - bVar47 & 0x1f)) + iVar59);
                auVar84 = pshuflw(auVar84,auVar84,0);
                uVar82 = auVar84._0_4_;
                *(undefined4 *)puVar68 = uVar82;
                *(undefined4 *)(puVar68 + 2) = uVar82;
                *(undefined4 *)(puVar68 + 4) = uVar82;
                *(undefined4 *)(puVar68 + 6) = uVar82;
                lVar79 = lVar79 + 1;
                puVar68 = puVar68 + 8;
              } while (lVar79 < lVar52);
            }
          }
          else if ((int)uVar55 < width + 6) {
            uVar77 = ((uint)lVar79 & 0xfffc) + (iVar64 + iVar74) * -4 & 0xffffffc0;
            sVar152 = auVar85._0_2_;
            sVar155 = auVar85._2_2_;
            uVar81 = (ulong)uVar9;
            if (width < (int)(uVar55 + 9) || (int)uVar55 < 7) {
              if (-7 < iVar65) {
                uVar66 = (uVar55 - width) + 8;
                iVar50 = uVar77 + iVar71;
                lVar79 = -7;
                puVar68 = local_128;
                do {
                  iVar67 = iVar78 + (int)lVar79;
                  if (lVar72 <= iVar78 + lVar79) {
                    iVar67 = iVar1;
                  }
                  if (iVar78 + lVar79 < 0) {
                    iVar67 = 0;
                  }
                  auVar84 = *(undefined1 (*) [16])
                             (ref + (long)(iVar67 * stride) + (long)(int)uVar55 + -7);
                  if ((int)uVar55 < 7) {
                    auVar84 = pshufb(auVar84,(undefined1  [16])warp_pad_left[6 - uVar55]);
                  }
                  if (-1 < (int)uVar66) {
                    auVar84 = pshufb(auVar84,(undefined1  [16])warp_pad_right[uVar66]);
                  }
                  aiVar2 = av1_filter_8bit[iVar50 >> 10];
                  aiVar3 = av1_filter_8bit[iVar74 + iVar50 >> 10];
                  iVar60 = iVar74 + iVar17 + iVar50;
                  aiVar4 = av1_filter_8bit[iVar17 + iVar50 >> 10];
                  auVar239._8_4_ = 0;
                  auVar239[0] = aiVar2[0];
                  auVar239[1] = aiVar2[1];
                  auVar239[2] = aiVar2[2];
                  auVar239[3] = aiVar2[3];
                  auVar239[4] = aiVar2[4];
                  auVar239[5] = aiVar2[5];
                  auVar239[6] = aiVar2[6];
                  auVar239[7] = aiVar2[7];
                  auVar239._12_2_ = aiVar2._6_2_;
                  auVar239._14_2_ = aiVar4._6_2_;
                  auVar238._12_4_ = auVar239._12_4_;
                  auVar238._8_2_ = 0;
                  auVar238[0] = aiVar2[0];
                  auVar238[1] = aiVar2[1];
                  auVar238[2] = aiVar2[2];
                  auVar238[3] = aiVar2[3];
                  auVar238[4] = aiVar2[4];
                  auVar238[5] = aiVar2[5];
                  auVar238[6] = aiVar2[6];
                  auVar238[7] = aiVar2[7];
                  auVar238._10_2_ = aiVar4._4_2_;
                  auVar237._10_6_ = auVar238._10_6_;
                  auVar237._8_2_ = aiVar2._4_2_;
                  auVar237[0] = aiVar2[0];
                  auVar237[1] = aiVar2[1];
                  auVar237[2] = aiVar2[2];
                  auVar237[3] = aiVar2[3];
                  auVar237[4] = aiVar2[4];
                  auVar237[5] = aiVar2[5];
                  auVar237[6] = aiVar2[6];
                  auVar237[7] = aiVar2[7];
                  auVar35._4_8_ = auVar237._8_8_;
                  auVar35._2_2_ = aiVar4._2_2_;
                  auVar35._0_2_ = aiVar2._2_2_;
                  auVar236._0_4_ = CONCAT22(aiVar4._0_2_,aiVar2._0_2_);
                  auVar236._4_12_ = auVar35;
                  iVar67 = iVar74 + iVar60;
                  aiVar2 = av1_filter_8bit[iVar60 >> 10];
                  auVar265._8_4_ = 0;
                  auVar265[0] = aiVar3[0];
                  auVar265[1] = aiVar3[1];
                  auVar265[2] = aiVar3[2];
                  auVar265[3] = aiVar3[3];
                  auVar265[4] = aiVar3[4];
                  auVar265[5] = aiVar3[5];
                  auVar265[6] = aiVar3[6];
                  auVar265[7] = aiVar3[7];
                  auVar265._12_2_ = aiVar3._6_2_;
                  auVar265._14_2_ = aiVar2._6_2_;
                  auVar264._12_4_ = auVar265._12_4_;
                  auVar264._8_2_ = 0;
                  auVar264[0] = aiVar3[0];
                  auVar264[1] = aiVar3[1];
                  auVar264[2] = aiVar3[2];
                  auVar264[3] = aiVar3[3];
                  auVar264[4] = aiVar3[4];
                  auVar264[5] = aiVar3[5];
                  auVar264[6] = aiVar3[6];
                  auVar264[7] = aiVar3[7];
                  auVar264._10_2_ = aiVar2._4_2_;
                  auVar263._10_6_ = auVar264._10_6_;
                  auVar263._8_2_ = aiVar3._4_2_;
                  auVar263[0] = aiVar3[0];
                  auVar263[1] = aiVar3[1];
                  auVar263[2] = aiVar3[2];
                  auVar263[3] = aiVar3[3];
                  auVar263[4] = aiVar3[4];
                  auVar263[5] = aiVar3[5];
                  auVar263[6] = aiVar3[6];
                  auVar263[7] = aiVar3[7];
                  auVar36._4_8_ = auVar263._8_8_;
                  auVar36._2_2_ = aiVar2._2_2_;
                  auVar36._0_2_ = aiVar3._2_2_;
                  auVar262._0_4_ = CONCAT22(aiVar2._0_2_,aiVar3._0_2_);
                  auVar262._4_12_ = auVar36;
                  iVar60 = iVar74 + iVar67;
                  aiVar2 = av1_filter_8bit[iVar67 >> 10];
                  iVar67 = iVar74 + iVar60;
                  aiVar3 = av1_filter_8bit[iVar60 >> 10];
                  aiVar4 = av1_filter_8bit[iVar67 >> 10];
                  auVar88._8_4_ = 0;
                  auVar88[0] = aiVar2[0];
                  auVar88[1] = aiVar2[1];
                  auVar88[2] = aiVar2[2];
                  auVar88[3] = aiVar2[3];
                  auVar88[4] = aiVar2[4];
                  auVar88[5] = aiVar2[5];
                  auVar88[6] = aiVar2[6];
                  auVar88[7] = aiVar2[7];
                  auVar88._12_2_ = aiVar2._6_2_;
                  auVar88._14_2_ = aiVar4._6_2_;
                  auVar87._12_4_ = auVar88._12_4_;
                  auVar87._8_2_ = 0;
                  auVar87[0] = aiVar2[0];
                  auVar87[1] = aiVar2[1];
                  auVar87[2] = aiVar2[2];
                  auVar87[3] = aiVar2[3];
                  auVar87[4] = aiVar2[4];
                  auVar87[5] = aiVar2[5];
                  auVar87[6] = aiVar2[6];
                  auVar87[7] = aiVar2[7];
                  auVar87._10_2_ = aiVar4._4_2_;
                  auVar86._10_6_ = auVar87._10_6_;
                  auVar86._8_2_ = aiVar2._4_2_;
                  auVar86[0] = aiVar2[0];
                  auVar86[1] = aiVar2[1];
                  auVar86[2] = aiVar2[2];
                  auVar86[3] = aiVar2[3];
                  auVar86[4] = aiVar2[4];
                  auVar86[5] = aiVar2[5];
                  auVar86[6] = aiVar2[6];
                  auVar86[7] = aiVar2[7];
                  auVar37._4_8_ = auVar86._8_8_;
                  auVar37._2_2_ = aiVar4._2_2_;
                  auVar37._0_2_ = aiVar2._2_2_;
                  auVar159._6_2_ = aiVar4._0_2_;
                  auVar159._4_2_ = aiVar2._0_2_;
                  aiVar2 = av1_filter_8bit[iVar74 + iVar67 >> 10];
                  auVar158._8_4_ = 0;
                  auVar158[0] = aiVar3[0];
                  auVar158[1] = aiVar3[1];
                  auVar158[2] = aiVar3[2];
                  auVar158[3] = aiVar3[3];
                  auVar158[4] = aiVar3[4];
                  auVar158[5] = aiVar3[5];
                  auVar158[6] = aiVar3[6];
                  auVar158[7] = aiVar3[7];
                  auVar158._12_2_ = aiVar3._6_2_;
                  auVar158._14_2_ = aiVar2._6_2_;
                  auVar157._12_4_ = auVar158._12_4_;
                  auVar157._8_2_ = 0;
                  auVar157[0] = aiVar3[0];
                  auVar157[1] = aiVar3[1];
                  auVar157[2] = aiVar3[2];
                  auVar157[3] = aiVar3[3];
                  auVar157[4] = aiVar3[4];
                  auVar157[5] = aiVar3[5];
                  auVar157[6] = aiVar3[6];
                  auVar157[7] = aiVar3[7];
                  auVar157._10_2_ = aiVar2._4_2_;
                  auVar156._10_6_ = auVar157._10_6_;
                  auVar156._8_2_ = aiVar3._4_2_;
                  auVar156[0] = aiVar3[0];
                  auVar156[1] = aiVar3[1];
                  auVar156[2] = aiVar3[2];
                  auVar156[3] = aiVar3[3];
                  auVar156[4] = aiVar3[4];
                  auVar156[5] = aiVar3[5];
                  auVar156[6] = aiVar3[6];
                  auVar156[7] = aiVar3[7];
                  auVar38._4_8_ = auVar156._8_8_;
                  auVar38._2_2_ = aiVar2._2_2_;
                  auVar38._0_2_ = aiVar3._2_2_;
                  auVar159._14_2_ = aiVar2._0_2_;
                  auVar159._12_2_ = aiVar3._0_2_;
                  auVar275._0_8_ = auVar236._0_8_;
                  auVar275._8_4_ = auVar35._0_4_;
                  auVar275._12_4_ = auVar37._0_4_;
                  auVar159._0_4_ = auVar236._0_4_;
                  auVar240._0_8_ = CONCAT44(auVar86._8_4_,auVar237._8_4_);
                  auVar240._8_4_ = auVar238._12_4_;
                  auVar240._12_4_ = auVar87._12_4_;
                  auVar89._0_8_ = auVar262._0_8_;
                  auVar89._8_4_ = auVar36._0_4_;
                  auVar89._12_4_ = auVar38._0_4_;
                  auVar159._8_4_ = auVar262._0_4_;
                  auVar266._0_8_ = CONCAT44(auVar156._8_4_,auVar263._8_4_);
                  auVar266._8_4_ = auVar264._12_4_;
                  auVar266._12_4_ = auVar157._12_4_;
                  auVar276._8_8_ = auVar89._8_8_;
                  auVar276._0_8_ = auVar275._8_8_;
                  auVar90._8_8_ = auVar266._0_8_;
                  auVar90._0_8_ = auVar240._0_8_;
                  in_XMM4._8_8_ = auVar266._8_8_;
                  in_XMM4._0_8_ = auVar240._8_8_;
                  auVar333 = pshufb(auVar84,auVar91);
                  auVar84 = pshufb(auVar84,auVar92);
                  auVar188._0_8_ = auVar84._0_8_;
                  auVar301._0_8_ = auVar333._0_8_;
                  auVar301._8_8_ = auVar188._0_8_;
                  auVar336 = pmaddubsw(auVar301,auVar159);
                  auVar306._0_8_ = auVar333._4_8_;
                  auVar306._8_4_ = auVar84._4_4_;
                  auVar306._12_4_ = auVar84._8_4_;
                  auVar343 = pmaddubsw(auVar306,auVar276);
                  auVar188._8_8_ = auVar333._2_8_;
                  in_XMM3 = pmaddubsw(auVar188,auVar90);
                  in_XMM5 = auVar333 >> 0x30;
                  auVar160._0_8_ = auVar84._4_8_;
                  auVar160._8_8_ = auVar333._6_8_;
                  auVar84 = pmaddubsw(auVar160,in_XMM4);
                  *puVar68 = (ushort)(auVar336._0_2_ + sVar152 + auVar343._0_2_ +
                                     auVar84._0_2_ + in_XMM3._0_2_) >> uVar81;
                  puVar68[1] = (ushort)(auVar336._2_2_ + sVar155 + auVar343._2_2_ +
                                       auVar84._2_2_ + in_XMM3._2_2_) >> uVar81;
                  puVar68[2] = (ushort)(auVar336._4_2_ + sVar152 + auVar343._4_2_ +
                                       auVar84._4_2_ + in_XMM3._4_2_) >> uVar81;
                  puVar68[3] = (ushort)(auVar336._6_2_ + sVar155 + auVar343._6_2_ +
                                       auVar84._6_2_ + in_XMM3._6_2_) >> uVar81;
                  puVar68[4] = (ushort)(auVar336._8_2_ + sVar152 + auVar343._8_2_ +
                                       auVar84._8_2_ + in_XMM3._8_2_) >> uVar81;
                  puVar68[5] = (ushort)(auVar336._10_2_ + sVar155 + auVar343._10_2_ +
                                       auVar84._10_2_ + in_XMM3._10_2_) >> uVar81;
                  puVar68[6] = (ushort)(auVar336._12_2_ + sVar152 + auVar343._12_2_ +
                                       auVar84._12_2_ + in_XMM3._12_2_) >> uVar81;
                  puVar68[7] = (ushort)(auVar336._14_2_ + sVar155 + auVar343._14_2_ +
                                       auVar84._14_2_ + in_XMM3._14_2_) >> uVar81;
                  lVar79 = lVar79 + 1;
                  iVar50 = iVar50 + iVar64;
                  puVar68 = puVar68 + 8;
                } while (lVar79 < lVar52);
              }
            }
            else {
              uVar66 = uVar77 + 0x10200;
              if (beta == 0 && alpha == 0) {
                if (-7 < iVar65) {
                  auVar333._8_8_ = 0;
                  auVar333._0_8_ = av1_filter_8bit[uVar66 >> 10];
                  auVar84 = pshuflw(auVar84,auVar333,0);
                  uVar82 = auVar84._0_4_;
                  in_XMM4._4_4_ = uVar82;
                  in_XMM4._0_4_ = uVar82;
                  in_XMM4._8_4_ = uVar82;
                  in_XMM4._12_4_ = uVar82;
                  auVar84 = pshuflw(auVar84,auVar333,0x55);
                  uVar82 = auVar84._0_4_;
                  in_XMM5._4_4_ = uVar82;
                  in_XMM5._0_4_ = uVar82;
                  in_XMM5._8_4_ = uVar82;
                  in_XMM5._12_4_ = uVar82;
                  auVar84 = pshuflw(auVar84,auVar333,0xaa);
                  uVar82 = auVar84._0_4_;
                  auVar336._4_4_ = uVar82;
                  auVar336._0_4_ = uVar82;
                  auVar336._8_4_ = uVar82;
                  auVar336._12_4_ = uVar82;
                  in_XMM3 = pshufb(auVar333,_DAT_00563890);
                  lVar63 = (long)iVar78 + -7;
                  puVar68 = local_128;
                  lVar79 = lVar57;
                  do {
                    iVar78 = iVar1;
                    if (lVar63 < lVar72) {
                      iVar78 = (int)lVar63;
                    }
                    if (lVar63 < 0) {
                      iVar78 = 0;
                    }
                    auVar193 = pshufb(*(undefined1 (*) [16])
                                       (ref + (long)(iVar78 * stride) +
                                              ((ulong)(uVar55 & 0x7fffffff) - 7)),auVar91);
                    auVar84 = pshufb(*(undefined1 (*) [16])
                                      (ref + (long)(iVar78 * stride) +
                                             ((ulong)(uVar55 & 0x7fffffff) - 7)),auVar92);
                    auVar343._0_8_ = auVar84._0_8_;
                    auVar198._0_8_ = auVar193._0_8_;
                    auVar198._8_8_ = auVar343._0_8_;
                    auVar198 = pmaddubsw(auVar198,in_XMM4);
                    auVar355._0_8_ = auVar193._4_8_;
                    auVar355._8_4_ = auVar84._4_4_;
                    auVar355._12_4_ = auVar84._8_4_;
                    auVar355 = pmaddubsw(auVar355,in_XMM5);
                    auVar343._8_8_ = auVar193._2_8_;
                    auVar333 = pmaddubsw(auVar343,auVar336);
                    auVar281._0_8_ = auVar84._4_8_;
                    auVar281._8_8_ = auVar193._6_8_;
                    auVar84 = pmaddubsw(auVar281,in_XMM3);
                    *puVar68 = (ushort)(auVar198._0_2_ + sVar152 + auVar355._0_2_ +
                                       auVar84._0_2_ + auVar333._0_2_) >> uVar81;
                    puVar68[1] = (ushort)(auVar198._2_2_ + sVar155 + auVar355._2_2_ +
                                         auVar84._2_2_ + auVar333._2_2_) >> uVar81;
                    puVar68[2] = (ushort)(auVar198._4_2_ + sVar152 + auVar355._4_2_ +
                                         auVar84._4_2_ + auVar333._4_2_) >> uVar81;
                    puVar68[3] = (ushort)(auVar198._6_2_ + sVar155 + auVar355._6_2_ +
                                         auVar84._6_2_ + auVar333._6_2_) >> uVar81;
                    puVar68[4] = (ushort)(auVar198._8_2_ + sVar152 + auVar355._8_2_ +
                                         auVar84._8_2_ + auVar333._8_2_) >> uVar81;
                    puVar68[5] = (ushort)(auVar198._10_2_ + sVar155 + auVar355._10_2_ +
                                         auVar84._10_2_ + auVar333._10_2_) >> uVar81;
                    puVar68[6] = (ushort)(auVar198._12_2_ + sVar152 + auVar355._12_2_ +
                                         auVar84._12_2_ + auVar333._12_2_) >> uVar81;
                    puVar68[7] = (ushort)(auVar198._14_2_ + sVar155 + auVar355._14_2_ +
                                         auVar84._14_2_ + auVar333._14_2_) >> uVar81;
                    puVar68 = puVar68 + 8;
                    lVar63 = lVar63 + 1;
                    lVar79 = lVar79 + -1;
                  } while (lVar79 != 0);
                }
              }
              else if (alpha != 0 || beta == 0) {
                if (alpha != 0 && beta == 0) {
                  if (-7 < iVar65) {
                    aiVar2 = av1_filter_8bit[(int)uVar66 >> 10];
                    aiVar3 = av1_filter_8bit[(int)(iVar17 + uVar66) >> 10];
                    auVar231._8_4_ = 0;
                    auVar231[0] = aiVar2[0];
                    auVar231[1] = aiVar2[1];
                    auVar231[2] = aiVar2[2];
                    auVar231[3] = aiVar2[3];
                    auVar231[4] = aiVar2[4];
                    auVar231[5] = aiVar2[5];
                    auVar231[6] = aiVar2[6];
                    auVar231[7] = aiVar2[7];
                    auVar231._12_2_ = aiVar2._6_2_;
                    auVar231._14_2_ = aiVar3._6_2_;
                    auVar230._12_4_ = auVar231._12_4_;
                    auVar230._8_2_ = 0;
                    auVar230[0] = aiVar2[0];
                    auVar230[1] = aiVar2[1];
                    auVar230[2] = aiVar2[2];
                    auVar230[3] = aiVar2[3];
                    auVar230[4] = aiVar2[4];
                    auVar230[5] = aiVar2[5];
                    auVar230[6] = aiVar2[6];
                    auVar230[7] = aiVar2[7];
                    auVar230._10_2_ = aiVar3._4_2_;
                    auVar229._10_6_ = auVar230._10_6_;
                    auVar229._8_2_ = aiVar2._4_2_;
                    auVar229[0] = aiVar2[0];
                    auVar229[1] = aiVar2[1];
                    auVar229[2] = aiVar2[2];
                    auVar229[3] = aiVar2[3];
                    auVar229[4] = aiVar2[4];
                    auVar229[5] = aiVar2[5];
                    auVar229[6] = aiVar2[6];
                    auVar229[7] = aiVar2[7];
                    auVar39._4_8_ = auVar229._8_8_;
                    auVar39._2_2_ = aiVar3._2_2_;
                    auVar39._0_2_ = aiVar2._2_2_;
                    auVar228._0_4_ = CONCAT22(aiVar3._0_2_,aiVar2._0_2_);
                    auVar228._4_12_ = auVar39;
                    aiVar2 = av1_filter_8bit[(int)(iVar74 * 4 + uVar66) >> 10];
                    aiVar3 = av1_filter_8bit[(int)(iVar74 * 6 + uVar66) >> 10];
                    auVar149._8_4_ = 0;
                    auVar149[0] = aiVar2[0];
                    auVar149[1] = aiVar2[1];
                    auVar149[2] = aiVar2[2];
                    auVar149[3] = aiVar2[3];
                    auVar149[4] = aiVar2[4];
                    auVar149[5] = aiVar2[5];
                    auVar149[6] = aiVar2[6];
                    auVar149[7] = aiVar2[7];
                    auVar149._12_2_ = aiVar2._6_2_;
                    auVar149._14_2_ = aiVar3._6_2_;
                    auVar148._12_4_ = auVar149._12_4_;
                    auVar148._8_2_ = 0;
                    auVar148[0] = aiVar2[0];
                    auVar148[1] = aiVar2[1];
                    auVar148[2] = aiVar2[2];
                    auVar148[3] = aiVar2[3];
                    auVar148[4] = aiVar2[4];
                    auVar148[5] = aiVar2[5];
                    auVar148[6] = aiVar2[6];
                    auVar148[7] = aiVar2[7];
                    auVar148._10_2_ = aiVar3._4_2_;
                    auVar147._10_6_ = auVar148._10_6_;
                    auVar147._8_2_ = aiVar2._4_2_;
                    auVar147[0] = aiVar2[0];
                    auVar147[1] = aiVar2[1];
                    auVar147[2] = aiVar2[2];
                    auVar147[3] = aiVar2[3];
                    auVar147[4] = aiVar2[4];
                    auVar147[5] = aiVar2[5];
                    auVar147[6] = aiVar2[6];
                    auVar147[7] = aiVar2[7];
                    auVar40._4_8_ = auVar147._8_8_;
                    auVar40._2_2_ = aiVar3._2_2_;
                    auVar40._0_2_ = aiVar2._2_2_;
                    in_XMM3._6_2_ = aiVar3._0_2_;
                    in_XMM3._4_2_ = aiVar2._0_2_;
                    auVar256._0_8_ = CONCAT44(auVar147._8_4_,auVar229._8_4_);
                    auVar256._8_4_ = auVar230._12_4_;
                    auVar256._12_4_ = auVar148._12_4_;
                    aiVar2 = av1_filter_8bit[(int)(iVar74 + uVar66) >> 10];
                    aiVar3 = av1_filter_8bit[(int)(iVar74 * 3 + uVar66) >> 10];
                    auVar180._8_4_ = 0;
                    auVar180[0] = aiVar2[0];
                    auVar180[1] = aiVar2[1];
                    auVar180[2] = aiVar2[2];
                    auVar180[3] = aiVar2[3];
                    auVar180[4] = aiVar2[4];
                    auVar180[5] = aiVar2[5];
                    auVar180[6] = aiVar2[6];
                    auVar180[7] = aiVar2[7];
                    auVar180._12_2_ = aiVar2._6_2_;
                    auVar180._14_2_ = aiVar3._6_2_;
                    auVar179._12_4_ = auVar180._12_4_;
                    auVar179._8_2_ = 0;
                    auVar179[0] = aiVar2[0];
                    auVar179[1] = aiVar2[1];
                    auVar179[2] = aiVar2[2];
                    auVar179[3] = aiVar2[3];
                    auVar179[4] = aiVar2[4];
                    auVar179[5] = aiVar2[5];
                    auVar179[6] = aiVar2[6];
                    auVar179[7] = aiVar2[7];
                    auVar179._10_2_ = aiVar3._4_2_;
                    auVar178._10_6_ = auVar179._10_6_;
                    auVar178._8_2_ = aiVar2._4_2_;
                    auVar178[0] = aiVar2[0];
                    auVar178[1] = aiVar2[1];
                    auVar178[2] = aiVar2[2];
                    auVar178[3] = aiVar2[3];
                    auVar178[4] = aiVar2[4];
                    auVar178[5] = aiVar2[5];
                    auVar178[6] = aiVar2[6];
                    auVar178[7] = aiVar2[7];
                    auVar41._4_8_ = auVar178._8_8_;
                    auVar41._2_2_ = aiVar3._2_2_;
                    auVar41._0_2_ = aiVar2._2_2_;
                    auVar177._0_4_ = CONCAT22(aiVar3._0_2_,aiVar2._0_2_);
                    auVar177._4_12_ = auVar41;
                    aiVar2 = av1_filter_8bit[(int)(iVar74 * 5 + uVar66) >> 10];
                    aiVar3 = av1_filter_8bit[(int)(uVar66 + iVar74 * 7) >> 10];
                    auVar297._8_4_ = 0;
                    auVar297[0] = aiVar2[0];
                    auVar297[1] = aiVar2[1];
                    auVar297[2] = aiVar2[2];
                    auVar297[3] = aiVar2[3];
                    auVar297[4] = aiVar2[4];
                    auVar297[5] = aiVar2[5];
                    auVar297[6] = aiVar2[6];
                    auVar297[7] = aiVar2[7];
                    auVar297._12_2_ = aiVar2._6_2_;
                    auVar297._14_2_ = aiVar3._6_2_;
                    auVar296._12_4_ = auVar297._12_4_;
                    auVar296._8_2_ = 0;
                    auVar296[0] = aiVar2[0];
                    auVar296[1] = aiVar2[1];
                    auVar296[2] = aiVar2[2];
                    auVar296[3] = aiVar2[3];
                    auVar296[4] = aiVar2[4];
                    auVar296[5] = aiVar2[5];
                    auVar296[6] = aiVar2[6];
                    auVar296[7] = aiVar2[7];
                    auVar296._10_2_ = aiVar3._4_2_;
                    auVar295._10_6_ = auVar296._10_6_;
                    auVar295._8_2_ = aiVar2._4_2_;
                    auVar295[0] = aiVar2[0];
                    auVar295[1] = aiVar2[1];
                    auVar295[2] = aiVar2[2];
                    auVar295[3] = aiVar2[3];
                    auVar295[4] = aiVar2[4];
                    auVar295[5] = aiVar2[5];
                    auVar295[6] = aiVar2[6];
                    auVar295[7] = aiVar2[7];
                    auVar42._4_8_ = auVar295._8_8_;
                    auVar42._2_2_ = aiVar3._2_2_;
                    auVar42._0_2_ = aiVar2._2_2_;
                    in_XMM3._14_2_ = aiVar3._0_2_;
                    in_XMM3._12_2_ = aiVar2._0_2_;
                    auVar303._0_8_ = CONCAT44(auVar295._8_4_,auVar178._8_4_);
                    auVar303._8_4_ = auVar179._12_4_;
                    auVar303._12_4_ = auVar296._12_4_;
                    in_XMM5._8_8_ = auVar303._8_8_;
                    in_XMM5._0_8_ = auVar256._8_8_;
                    in_XMM4._8_8_ = auVar303._0_8_;
                    in_XMM4._0_8_ = auVar256._0_8_;
                    auVar232._0_8_ = auVar228._0_8_;
                    auVar232._8_4_ = auVar39._0_4_;
                    auVar232._12_4_ = auVar40._0_4_;
                    in_XMM3._0_4_ = auVar228._0_4_;
                    auVar181._0_8_ = auVar177._0_8_;
                    auVar181._8_4_ = auVar41._0_4_;
                    auVar181._12_4_ = auVar42._0_4_;
                    in_XMM3._8_4_ = auVar177._0_4_;
                    auVar298._8_8_ = auVar181._8_8_;
                    auVar298._0_8_ = auVar232._8_8_;
                    lVar63 = (long)iVar78 + -7;
                    puVar68 = local_128;
                    lVar79 = lVar57;
                    do {
                      iVar78 = iVar1;
                      if (lVar63 < lVar72) {
                        iVar78 = (int)lVar63;
                      }
                      if (lVar63 < 0) {
                        iVar78 = 0;
                      }
                      auVar336 = pshufb(*(undefined1 (*) [16])
                                         (ref + (long)(iVar78 * stride) +
                                                ((ulong)(uVar55 & 0x7fffffff) - 7)),auVar91);
                      auVar84 = pshufb(*(undefined1 (*) [16])
                                        (ref + (long)(iVar78 * stride) +
                                               ((ulong)(uVar55 & 0x7fffffff) - 7)),auVar92);
                      auVar150._0_8_ = auVar84._0_8_;
                      auVar304._0_8_ = auVar336._0_8_;
                      auVar304._8_8_ = auVar150._0_8_;
                      auVar343 = pmaddubsw(auVar304,in_XMM3);
                      auVar314._0_8_ = auVar336._4_8_;
                      auVar314._8_4_ = auVar84._4_4_;
                      auVar314._12_4_ = auVar84._8_4_;
                      auVar193 = pmaddubsw(auVar314,auVar298);
                      auVar150._8_8_ = auVar336._2_8_;
                      auVar333 = pmaddubsw(auVar150,in_XMM4);
                      auVar309._0_8_ = auVar84._4_8_;
                      auVar309._8_8_ = auVar336._6_8_;
                      auVar84 = pmaddubsw(auVar309,in_XMM5);
                      *puVar68 = (ushort)(auVar343._0_2_ + sVar152 + auVar193._0_2_ +
                                         auVar84._0_2_ + auVar333._0_2_) >> uVar81;
                      puVar68[1] = (ushort)(auVar343._2_2_ + sVar155 + auVar193._2_2_ +
                                           auVar84._2_2_ + auVar333._2_2_) >> uVar81;
                      puVar68[2] = (ushort)(auVar343._4_2_ + sVar152 + auVar193._4_2_ +
                                           auVar84._4_2_ + auVar333._4_2_) >> uVar81;
                      puVar68[3] = (ushort)(auVar343._6_2_ + sVar155 + auVar193._6_2_ +
                                           auVar84._6_2_ + auVar333._6_2_) >> uVar81;
                      puVar68[4] = (ushort)(auVar343._8_2_ + sVar152 + auVar193._8_2_ +
                                           auVar84._8_2_ + auVar333._8_2_) >> uVar81;
                      puVar68[5] = (ushort)(auVar343._10_2_ + sVar155 + auVar193._10_2_ +
                                           auVar84._10_2_ + auVar333._10_2_) >> uVar81;
                      puVar68[6] = (ushort)(auVar343._12_2_ + sVar152 + auVar193._12_2_ +
                                           auVar84._12_2_ + auVar333._12_2_) >> uVar81;
                      puVar68[7] = (ushort)(auVar343._14_2_ + sVar155 + auVar193._14_2_ +
                                           auVar84._14_2_ + auVar333._14_2_) >> uVar81;
                      puVar68 = puVar68 + 8;
                      lVar63 = lVar63 + 1;
                      lVar79 = lVar79 + -1;
                    } while (lVar79 != 0);
                  }
                }
                else if (-7 < iVar65) {
                  iVar50 = uVar77 + iVar71;
                  lVar63 = (long)iVar78 + -7;
                  puVar68 = local_128;
                  lVar79 = lVar57;
                  do {
                    iVar78 = iVar1;
                    if (lVar63 < lVar72) {
                      iVar78 = (int)lVar63;
                    }
                    if (lVar63 < 0) {
                      iVar78 = 0;
                    }
                    aiVar2 = av1_filter_8bit[iVar50 >> 10];
                    aiVar3 = av1_filter_8bit[iVar74 + iVar50 >> 10];
                    iVar60 = iVar74 + iVar17 + iVar50;
                    aiVar4 = av1_filter_8bit[iVar17 + iVar50 >> 10];
                    auVar260._8_4_ = 0;
                    auVar260[0] = aiVar2[0];
                    auVar260[1] = aiVar2[1];
                    auVar260[2] = aiVar2[2];
                    auVar260[3] = aiVar2[3];
                    auVar260[4] = aiVar2[4];
                    auVar260[5] = aiVar2[5];
                    auVar260[6] = aiVar2[6];
                    auVar260[7] = aiVar2[7];
                    auVar260._12_2_ = aiVar2._6_2_;
                    auVar260._14_2_ = aiVar4._6_2_;
                    auVar259._12_4_ = auVar260._12_4_;
                    auVar259._8_2_ = 0;
                    auVar259[0] = aiVar2[0];
                    auVar259[1] = aiVar2[1];
                    auVar259[2] = aiVar2[2];
                    auVar259[3] = aiVar2[3];
                    auVar259[4] = aiVar2[4];
                    auVar259[5] = aiVar2[5];
                    auVar259[6] = aiVar2[6];
                    auVar259[7] = aiVar2[7];
                    auVar259._10_2_ = aiVar4._4_2_;
                    auVar258._10_6_ = auVar259._10_6_;
                    auVar258._8_2_ = aiVar2._4_2_;
                    auVar258[0] = aiVar2[0];
                    auVar258[1] = aiVar2[1];
                    auVar258[2] = aiVar2[2];
                    auVar258[3] = aiVar2[3];
                    auVar258[4] = aiVar2[4];
                    auVar258[5] = aiVar2[5];
                    auVar258[6] = aiVar2[6];
                    auVar258[7] = aiVar2[7];
                    auVar43._4_8_ = auVar258._8_8_;
                    auVar43._2_2_ = aiVar4._2_2_;
                    auVar43._0_2_ = aiVar2._2_2_;
                    auVar257._0_4_ = CONCAT22(aiVar4._0_2_,aiVar2._0_2_);
                    auVar257._4_12_ = auVar43;
                    iVar67 = iVar74 + iVar60;
                    aiVar2 = av1_filter_8bit[iVar60 >> 10];
                    auVar273._8_4_ = 0;
                    auVar273[0] = aiVar3[0];
                    auVar273[1] = aiVar3[1];
                    auVar273[2] = aiVar3[2];
                    auVar273[3] = aiVar3[3];
                    auVar273[4] = aiVar3[4];
                    auVar273[5] = aiVar3[5];
                    auVar273[6] = aiVar3[6];
                    auVar273[7] = aiVar3[7];
                    auVar273._12_2_ = aiVar3._6_2_;
                    auVar273._14_2_ = aiVar2._6_2_;
                    auVar272._12_4_ = auVar273._12_4_;
                    auVar272._8_2_ = 0;
                    auVar272[0] = aiVar3[0];
                    auVar272[1] = aiVar3[1];
                    auVar272[2] = aiVar3[2];
                    auVar272[3] = aiVar3[3];
                    auVar272[4] = aiVar3[4];
                    auVar272[5] = aiVar3[5];
                    auVar272[6] = aiVar3[6];
                    auVar272[7] = aiVar3[7];
                    auVar272._10_2_ = aiVar2._4_2_;
                    auVar271._10_6_ = auVar272._10_6_;
                    auVar271._8_2_ = aiVar3._4_2_;
                    auVar271[0] = aiVar3[0];
                    auVar271[1] = aiVar3[1];
                    auVar271[2] = aiVar3[2];
                    auVar271[3] = aiVar3[3];
                    auVar271[4] = aiVar3[4];
                    auVar271[5] = aiVar3[5];
                    auVar271[6] = aiVar3[6];
                    auVar271[7] = aiVar3[7];
                    auVar44._4_8_ = auVar271._8_8_;
                    auVar44._2_2_ = aiVar2._2_2_;
                    auVar44._0_2_ = aiVar3._2_2_;
                    auVar270._0_4_ = CONCAT22(aiVar2._0_2_,aiVar3._0_2_);
                    auVar270._4_12_ = auVar44;
                    iVar60 = iVar74 + iVar67;
                    aiVar2 = av1_filter_8bit[iVar67 >> 10];
                    iVar67 = iVar74 + iVar60;
                    aiVar3 = av1_filter_8bit[iVar60 >> 10];
                    aiVar4 = av1_filter_8bit[iVar67 >> 10];
                    auVar193._8_4_ = 0;
                    auVar193[0] = aiVar2[0];
                    auVar193[1] = aiVar2[1];
                    auVar193[2] = aiVar2[2];
                    auVar193[3] = aiVar2[3];
                    auVar193[4] = aiVar2[4];
                    auVar193[5] = aiVar2[5];
                    auVar193[6] = aiVar2[6];
                    auVar193[7] = aiVar2[7];
                    auVar193._12_2_ = aiVar2._6_2_;
                    auVar193._14_2_ = aiVar4._6_2_;
                    auVar246._12_4_ = auVar193._12_4_;
                    auVar246._8_2_ = 0;
                    auVar246[0] = aiVar2[0];
                    auVar246[1] = aiVar2[1];
                    auVar246[2] = aiVar2[2];
                    auVar246[3] = aiVar2[3];
                    auVar246[4] = aiVar2[4];
                    auVar246[5] = aiVar2[5];
                    auVar246[6] = aiVar2[6];
                    auVar246[7] = aiVar2[7];
                    auVar246._10_2_ = aiVar4._4_2_;
                    auVar286._10_6_ = auVar246._10_6_;
                    auVar286._8_2_ = aiVar2._4_2_;
                    auVar286[0] = aiVar2[0];
                    auVar286[1] = aiVar2[1];
                    auVar286[2] = aiVar2[2];
                    auVar286[3] = aiVar2[3];
                    auVar286[4] = aiVar2[4];
                    auVar286[5] = aiVar2[5];
                    auVar286[6] = aiVar2[6];
                    auVar286[7] = aiVar2[7];
                    auVar45._4_8_ = auVar286._8_8_;
                    auVar45._2_2_ = aiVar4._2_2_;
                    auVar45._0_2_ = aiVar2._2_2_;
                    auVar185._6_2_ = aiVar4._0_2_;
                    auVar185._4_2_ = aiVar2._0_2_;
                    aiVar2 = av1_filter_8bit[iVar74 + iVar67 >> 10];
                    auVar184._8_4_ = 0;
                    auVar184[0] = aiVar3[0];
                    auVar184[1] = aiVar3[1];
                    auVar184[2] = aiVar3[2];
                    auVar184[3] = aiVar3[3];
                    auVar184[4] = aiVar3[4];
                    auVar184[5] = aiVar3[5];
                    auVar184[6] = aiVar3[6];
                    auVar184[7] = aiVar3[7];
                    auVar184._12_2_ = aiVar3._6_2_;
                    auVar184._14_2_ = aiVar2._6_2_;
                    auVar183._12_4_ = auVar184._12_4_;
                    auVar183._8_2_ = 0;
                    auVar183[0] = aiVar3[0];
                    auVar183[1] = aiVar3[1];
                    auVar183[2] = aiVar3[2];
                    auVar183[3] = aiVar3[3];
                    auVar183[4] = aiVar3[4];
                    auVar183[5] = aiVar3[5];
                    auVar183[6] = aiVar3[6];
                    auVar183[7] = aiVar3[7];
                    auVar183._10_2_ = aiVar2._4_2_;
                    auVar182._10_6_ = auVar183._10_6_;
                    auVar182._8_2_ = aiVar3._4_2_;
                    auVar182[0] = aiVar3[0];
                    auVar182[1] = aiVar3[1];
                    auVar182[2] = aiVar3[2];
                    auVar182[3] = aiVar3[3];
                    auVar182[4] = aiVar3[4];
                    auVar182[5] = aiVar3[5];
                    auVar182[6] = aiVar3[6];
                    auVar182[7] = aiVar3[7];
                    auVar46._4_8_ = auVar182._8_8_;
                    auVar46._2_2_ = aiVar2._2_2_;
                    auVar46._0_2_ = aiVar3._2_2_;
                    auVar185._14_2_ = aiVar2._0_2_;
                    auVar185._12_2_ = aiVar3._0_2_;
                    auVar299._0_8_ = auVar257._0_8_;
                    auVar299._8_4_ = auVar43._0_4_;
                    auVar299._12_4_ = auVar45._0_4_;
                    auVar185._0_4_ = auVar257._0_4_;
                    auVar261._0_8_ = CONCAT44(auVar286._8_4_,auVar258._8_4_);
                    auVar261._8_4_ = auVar259._12_4_;
                    auVar261._12_4_ = auVar246._12_4_;
                    auVar326._0_8_ = auVar270._0_8_;
                    auVar326._8_4_ = auVar44._0_4_;
                    auVar326._12_4_ = auVar46._0_4_;
                    auVar185._8_4_ = auVar270._0_4_;
                    auVar274._0_8_ = CONCAT44(auVar182._8_4_,auVar271._8_4_);
                    auVar274._8_4_ = auVar272._12_4_;
                    auVar274._12_4_ = auVar183._12_4_;
                    auVar300._8_8_ = auVar326._8_8_;
                    auVar300._0_8_ = auVar299._8_8_;
                    auVar151._8_8_ = auVar274._0_8_;
                    auVar151._0_8_ = auVar261._0_8_;
                    in_XMM4._8_8_ = auVar274._8_8_;
                    in_XMM4._0_8_ = auVar261._8_8_;
                    auVar333 = pshufb(*(undefined1 (*) [16])
                                       (ref + (long)(iVar78 * stride) +
                                              ((ulong)(uVar55 & 0x7fffffff) - 7)),auVar91);
                    auVar84 = pshufb(*(undefined1 (*) [16])
                                      (ref + (long)(iVar78 * stride) +
                                             ((ulong)(uVar55 & 0x7fffffff) - 7)),auVar92);
                    auVar233._0_8_ = auVar84._0_8_;
                    auVar305._0_8_ = auVar333._0_8_;
                    auVar305._8_8_ = auVar233._0_8_;
                    auVar336 = pmaddubsw(auVar305,auVar185);
                    auVar310._0_8_ = auVar333._4_8_;
                    auVar310._8_4_ = auVar84._4_4_;
                    auVar310._12_4_ = auVar84._8_4_;
                    auVar343 = pmaddubsw(auVar310,auVar300);
                    auVar233._8_8_ = auVar333._2_8_;
                    in_XMM3 = pmaddubsw(auVar233,auVar151);
                    in_XMM5 = auVar333 >> 0x30;
                    auVar186._0_8_ = auVar84._4_8_;
                    auVar186._8_8_ = auVar333._6_8_;
                    auVar84 = pmaddubsw(auVar186,in_XMM4);
                    *puVar68 = (ushort)(auVar336._0_2_ + sVar152 + auVar343._0_2_ +
                                       auVar84._0_2_ + in_XMM3._0_2_) >> uVar81;
                    puVar68[1] = (ushort)(auVar336._2_2_ + sVar155 + auVar343._2_2_ +
                                         auVar84._2_2_ + in_XMM3._2_2_) >> uVar81;
                    puVar68[2] = (ushort)(auVar336._4_2_ + sVar152 + auVar343._4_2_ +
                                         auVar84._4_2_ + in_XMM3._4_2_) >> uVar81;
                    puVar68[3] = (ushort)(auVar336._6_2_ + sVar155 + auVar343._6_2_ +
                                         auVar84._6_2_ + in_XMM3._6_2_) >> uVar81;
                    puVar68[4] = (ushort)(auVar336._8_2_ + sVar152 + auVar343._8_2_ +
                                         auVar84._8_2_ + in_XMM3._8_2_) >> uVar81;
                    puVar68[5] = (ushort)(auVar336._10_2_ + sVar155 + auVar343._10_2_ +
                                         auVar84._10_2_ + in_XMM3._10_2_) >> uVar81;
                    puVar68[6] = (ushort)(auVar336._12_2_ + sVar152 + auVar343._12_2_ +
                                         auVar84._12_2_ + in_XMM3._12_2_) >> uVar81;
                    puVar68[7] = (ushort)(auVar336._14_2_ + sVar155 + auVar343._14_2_ +
                                         auVar84._14_2_ + in_XMM3._14_2_) >> uVar81;
                    puVar68 = puVar68 + 8;
                    iVar50 = iVar50 + iVar64;
                    lVar63 = lVar63 + 1;
                    lVar79 = lVar79 + -1;
                  } while (lVar79 != 0);
                }
              }
              else if (-7 < iVar65) {
                iVar50 = uVar77 + iVar71;
                lVar63 = (long)iVar78 + -7;
                puVar68 = local_128;
                lVar79 = lVar57;
                do {
                  iVar78 = iVar1;
                  if (lVar63 < lVar72) {
                    iVar78 = (int)lVar63;
                  }
                  if (lVar63 < 0) {
                    iVar78 = 0;
                  }
                  auVar176._8_8_ = 0;
                  auVar176._0_8_ = av1_filter_8bit[iVar50 >> 10];
                  auVar84 = pshuflw(in_XMM3,auVar176,0);
                  auVar226._0_4_ = auVar84._0_4_;
                  auVar226._4_4_ = auVar226._0_4_;
                  auVar226._8_4_ = auVar226._0_4_;
                  auVar226._12_4_ = auVar226._0_4_;
                  auVar84 = pshuflw(in_XMM4,auVar176,0x55);
                  auVar255._0_4_ = auVar84._0_4_;
                  auVar255._4_4_ = auVar255._0_4_;
                  auVar255._8_4_ = auVar255._0_4_;
                  auVar255._12_4_ = auVar255._0_4_;
                  auVar84 = pshuflw(in_XMM5,auVar176,0xaa);
                  in_XMM5._0_4_ = auVar84._0_4_;
                  in_XMM5._4_4_ = in_XMM5._0_4_;
                  in_XMM5._8_4_ = in_XMM5._0_4_;
                  in_XMM5._12_4_ = in_XMM5._0_4_;
                  auVar336 = pshufb(auVar176,_DAT_00563890);
                  auVar343 = pshufb(*(undefined1 (*) [16])
                                     (ref + (long)(iVar78 * stride) +
                                            ((ulong)(uVar55 & 0x7fffffff) - 7)),auVar91);
                  auVar84 = pshufb(*(undefined1 (*) [16])
                                    (ref + (long)(iVar78 * stride) +
                                           ((ulong)(uVar55 & 0x7fffffff) - 7)),auVar92);
                  auVar146._0_8_ = auVar84._0_8_;
                  auVar302._0_8_ = auVar343._0_8_;
                  auVar302._8_8_ = auVar146._0_8_;
                  auVar193 = pmaddubsw(auVar302,auVar226);
                  auVar308._0_8_ = auVar343._4_8_;
                  auVar308._8_4_ = auVar84._4_4_;
                  auVar308._12_4_ = auVar84._8_4_;
                  auVar198 = pmaddubsw(auVar308,auVar255);
                  in_XMM4 = auVar343 >> 0x10;
                  auVar146._8_8_ = auVar343._2_8_;
                  auVar333 = pmaddubsw(auVar146,in_XMM5);
                  auVar227._0_8_ = auVar84._4_8_;
                  auVar227._8_8_ = auVar343._6_8_;
                  auVar84 = pmaddubsw(auVar227,auVar336);
                  in_XMM3._0_2_ = auVar84._0_2_ + auVar333._0_2_;
                  in_XMM3._2_2_ = auVar84._2_2_ + auVar333._2_2_;
                  in_XMM3._4_2_ = auVar84._4_2_ + auVar333._4_2_;
                  in_XMM3._6_2_ = auVar84._6_2_ + auVar333._6_2_;
                  in_XMM3._8_2_ = auVar84._8_2_ + auVar333._8_2_;
                  in_XMM3._10_2_ = auVar84._10_2_ + auVar333._10_2_;
                  in_XMM3._12_2_ = auVar84._12_2_ + auVar333._12_2_;
                  in_XMM3._14_2_ = auVar84._14_2_ + auVar333._14_2_;
                  *puVar68 = (ushort)(auVar193._0_2_ + sVar152 + auVar198._0_2_ + in_XMM3._0_2_) >>
                             uVar81;
                  puVar68[1] = (ushort)(auVar193._2_2_ + sVar155 + auVar198._2_2_ + in_XMM3._2_2_)
                               >> uVar81;
                  puVar68[2] = (ushort)(auVar193._4_2_ + sVar152 + auVar198._4_2_ + in_XMM3._4_2_)
                               >> uVar81;
                  puVar68[3] = (ushort)(auVar193._6_2_ + sVar155 + auVar198._6_2_ + in_XMM3._6_2_)
                               >> uVar81;
                  puVar68[4] = (ushort)(auVar193._8_2_ + sVar152 + auVar198._8_2_ + in_XMM3._8_2_)
                               >> uVar81;
                  puVar68[5] = (ushort)(auVar193._10_2_ + sVar155 + auVar198._10_2_ + in_XMM3._10_2_
                                       ) >> uVar81;
                  puVar68[6] = (ushort)(auVar193._12_2_ + sVar152 + auVar198._12_2_ + in_XMM3._12_2_
                                       ) >> uVar81;
                  puVar68[7] = (ushort)(auVar193._14_2_ + sVar155 + auVar198._14_2_ + in_XMM3._14_2_
                                       ) >> uVar81;
                  puVar68 = puVar68 + 8;
                  iVar50 = iVar50 + iVar64;
                  lVar63 = lVar63 + 1;
                  lVar79 = lVar79 + -1;
                } while (lVar79 != 0);
              }
            }
          }
          else if (-7 < iVar65) {
            lVar79 = -7;
            puVar68 = local_128;
            do {
              iVar50 = iVar78 + (int)lVar79;
              if (lVar72 <= iVar78 + lVar79) {
                iVar50 = iVar1;
              }
              if (iVar78 + lVar79 < 0) {
                iVar50 = 0;
              }
              auVar84 = ZEXT416(((uint)ref[iVar50 * stride + width + -1] << (7 - bVar47 & 0x1f)) +
                                iVar59);
              auVar84 = pshuflw(auVar84,auVar84,0);
              uVar82 = auVar84._0_4_;
              *(undefined4 *)puVar68 = uVar82;
              *(undefined4 *)(puVar68 + 2) = uVar82;
              *(undefined4 *)(puVar68 + 4) = uVar82;
              *(undefined4 *)(puVar68 + 6) = uVar82;
              lVar79 = lVar79 + 1;
              puVar68 = puVar68 + 8;
            } while (lVar79 < lVar52);
          }
          iVar50 = (((uint)lVar53 & 0xfffc) + (iVar80 + iVar76) * -4 & 0xffffffc0) + 0x10200;
          uVar82 = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
          auVar91 = ZEXT416(uVar73);
          auVar92 = ZEXT416(local_310);
          iVar78 = iVar50 >> 10;
          auVar84 = auVar92;
          if (delta == 0 && gamma == 0) {
            if (0 < iVar65) {
              uVar83 = *(undefined4 *)av1_warped_filter[iVar78];
              uVar18 = *(undefined4 *)(av1_warped_filter[iVar78] + 2);
              uVar19 = *(undefined4 *)(av1_warped_filter[iVar78] + 4);
              uVar20 = *(undefined4 *)(av1_warped_filter[iVar78] + 6);
              auVar312._4_4_ = uVar83;
              auVar312._0_4_ = uVar83;
              auVar312._8_4_ = uVar83;
              auVar312._12_4_ = uVar83;
              in_XMM5._4_4_ = uVar18;
              in_XMM5._0_4_ = uVar18;
              in_XMM5._8_4_ = uVar18;
              in_XMM5._12_4_ = uVar18;
              bVar16 = local_32c - (char)*local_2e8;
              auVar316._4_4_ = uVar19;
              auVar316._0_4_ = uVar19;
              auVar316._8_4_ = uVar19;
              auVar316._12_4_ = uVar19;
              auVar324._4_4_ = uVar20;
              auVar324._0_4_ = uVar20;
              auVar324._8_4_ = uVar20;
              auVar324._12_4_ = uVar20;
              auVar84 = ZEXT416((-1 << (bVar16 & 0x1f)) + uVar49 + (-1 << (bVar16 - 1 & 0x1f)));
              auVar84 = pshuflw(auVar84,auVar84,0);
              local_2d8 = auVar84._0_2_;
              sStack_2d6 = auVar84._2_2_;
              puVar54 = local_b8;
              uVar81 = uVar62;
              iVar78 = local_328;
              iVar50 = iVar61;
              do {
                auVar84 = *(undefined1 (*) [16])(puVar54 + -0x38);
                auVar333 = *(undefined1 (*) [16])(puVar54 + -0x28);
                auVar336 = *(undefined1 (*) [16])(puVar54 + -0x20);
                auVar204._0_12_ = auVar84._0_12_;
                auVar204._12_2_ = auVar84._6_2_;
                auVar204._14_2_ = puVar54[-0x2d];
                auVar203._12_4_ = auVar204._12_4_;
                auVar203._0_10_ = auVar84._0_10_;
                auVar203._10_2_ = puVar54[-0x2e];
                auVar202._10_6_ = auVar203._10_6_;
                auVar202._0_8_ = auVar84._0_8_;
                auVar202._8_2_ = auVar84._4_2_;
                auVar201._8_8_ = auVar202._8_8_;
                auVar201._6_2_ = puVar54[-0x2f];
                auVar201._4_2_ = auVar84._2_2_;
                auVar201._0_2_ = auVar84._0_2_;
                auVar201._2_2_ = puVar54[-0x30];
                auVar359._0_12_ = auVar333._0_12_;
                auVar359._12_2_ = auVar333._6_2_;
                auVar359._14_2_ = auVar336._6_2_;
                auVar358._12_4_ = auVar359._12_4_;
                auVar358._0_10_ = auVar333._0_10_;
                auVar358._10_2_ = auVar336._4_2_;
                auVar357._10_6_ = auVar358._10_6_;
                auVar357._0_8_ = auVar333._0_8_;
                auVar357._8_2_ = auVar333._4_2_;
                auVar356._8_8_ = auVar357._8_8_;
                auVar356._6_2_ = auVar336._2_2_;
                auVar356._4_2_ = auVar333._2_2_;
                auVar356._0_2_ = auVar333._0_2_;
                auVar356._2_2_ = auVar336._0_2_;
                auVar343 = *(undefined1 (*) [16])(puVar54 + -0x18);
                auVar347._0_12_ = auVar343._0_12_;
                auVar347._12_2_ = auVar343._6_2_;
                auVar347._14_2_ = puVar54[-0xd];
                auVar346._12_4_ = auVar347._12_4_;
                auVar346._0_10_ = auVar343._0_10_;
                auVar346._10_2_ = puVar54[-0xe];
                auVar345._10_6_ = auVar346._10_6_;
                auVar345._0_8_ = auVar343._0_8_;
                auVar345._8_2_ = auVar343._4_2_;
                auVar344._8_8_ = auVar345._8_8_;
                auVar344._6_2_ = puVar54[-0xf];
                auVar344._4_2_ = auVar343._2_2_;
                auVar344._0_2_ = auVar343._0_2_;
                auVar344._2_2_ = puVar54[-0x10];
                auVar193 = *(undefined1 (*) [16])(puVar54 + -8);
                auVar198 = pmaddwd(auVar201,auVar312);
                auVar246 = pmaddwd(auVar356,in_XMM5);
                auVar208._0_12_ = auVar193._0_12_;
                auVar208._12_2_ = auVar193._6_2_;
                auVar208._14_2_ = puVar54[3];
                auVar207._12_4_ = auVar208._12_4_;
                auVar207._0_10_ = auVar193._0_10_;
                auVar207._10_2_ = puVar54[2];
                auVar206._10_6_ = auVar207._10_6_;
                auVar206._0_8_ = auVar193._0_8_;
                auVar206._8_2_ = auVar193._4_2_;
                auVar205._8_8_ = auVar206._8_8_;
                auVar205._6_2_ = puVar54[1];
                auVar205._4_2_ = auVar193._2_2_;
                auVar205._0_2_ = auVar193._0_2_;
                auVar205._2_2_ = *puVar54;
                auVar355 = pmaddwd(auVar344,auVar316);
                auVar281 = pmaddwd(auVar205,auVar324);
                iVar67 = auVar281._8_4_ + auVar355._8_4_ + auVar246._8_4_ + auVar198._8_4_;
                iVar60 = auVar281._12_4_ + auVar355._12_4_ + auVar246._12_4_ + auVar198._12_4_;
                auVar241._2_2_ = puVar54[-0x2c];
                auVar241._0_2_ = auVar84._8_2_;
                auVar241._4_2_ = auVar84._10_2_;
                auVar241._6_2_ = puVar54[-0x2b];
                auVar241._8_2_ = auVar84._12_2_;
                auVar241._10_2_ = puVar54[-0x2a];
                auVar241._12_2_ = auVar84._14_2_;
                auVar241._14_2_ = puVar54[-0x29];
                auVar103._2_2_ = auVar336._8_2_;
                auVar103._0_2_ = auVar333._8_2_;
                auVar103._4_2_ = auVar333._10_2_;
                auVar103._6_2_ = auVar336._10_2_;
                auVar103._8_2_ = auVar333._12_2_;
                auVar103._10_2_ = auVar336._12_2_;
                auVar103._12_2_ = auVar333._14_2_;
                auVar103._14_2_ = auVar336._14_2_;
                auVar153._2_2_ = puVar54[-0xc];
                auVar153._0_2_ = auVar343._8_2_;
                auVar153._4_2_ = auVar343._10_2_;
                auVar153._6_2_ = puVar54[-0xb];
                auVar153._8_2_ = auVar343._12_2_;
                auVar153._10_2_ = puVar54[-10];
                auVar153._12_2_ = auVar343._14_2_;
                auVar153._14_2_ = puVar54[-9];
                auVar337._2_2_ = puVar54[4];
                auVar337._0_2_ = auVar193._8_2_;
                auVar337._4_2_ = auVar193._10_2_;
                auVar337._6_2_ = puVar54[5];
                auVar337._8_2_ = auVar193._12_2_;
                auVar337._10_2_ = puVar54[6];
                auVar337._12_2_ = auVar193._14_2_;
                auVar337._14_2_ = puVar54[7];
                in_XMM4 = pmaddwd(auVar241,auVar312);
                auVar84 = pmaddwd(auVar103,in_XMM5);
                auVar333 = pmaddwd(auVar153,auVar316);
                auVar336 = pmaddwd(auVar337,auVar324);
                iVar234 = auVar336._8_4_ + auVar333._8_4_ + auVar84._8_4_ + in_XMM4._8_4_;
                iVar340 = auVar336._12_4_ + auVar333._12_4_ + auVar84._12_4_ + in_XMM4._12_4_;
                in_XMM3._4_4_ = iVar234;
                in_XMM3._0_4_ = iVar67;
                in_XMM3._8_4_ = iVar60;
                in_XMM3._12_4_ = iVar340;
                auVar104._0_4_ =
                     auVar281._0_4_ + auVar355._0_4_ + auVar246._0_4_ + auVar198._0_4_ + iVar48 >>
                     auVar91;
                auVar104._4_4_ =
                     auVar336._0_4_ + auVar333._0_4_ + auVar84._0_4_ + in_XMM4._0_4_ + iVar48 >>
                     auVar91;
                auVar104._8_4_ =
                     auVar281._4_4_ + auVar355._4_4_ + auVar246._4_4_ + auVar198._4_4_ + iVar48 >>
                     auVar91;
                auVar104._12_4_ =
                     auVar336._4_4_ + auVar333._4_4_ + auVar84._4_4_ + in_XMM4._4_4_ + iVar48 >>
                     auVar91;
                if (conv_params->is_compound == 0) {
                  auVar105._4_4_ = auVar104._4_4_;
                  auVar105._0_4_ = auVar104._0_4_;
                  auVar105._8_4_ = auVar104._8_4_;
                  auVar105._12_4_ = auVar104._12_4_;
                  in_XMM3._0_4_ = iVar67 + iVar48 >> auVar91;
                  in_XMM3._4_4_ = iVar234 + iVar48 >> auVar91;
                  in_XMM3._8_4_ = iVar60 + iVar48 >> auVar91;
                  in_XMM3._12_4_ = iVar340 + iVar48 >> auVar91;
                  auVar333 = packssdw(auVar105,in_XMM3);
                  sVar152 = auVar333._0_2_;
                  sVar155 = auVar333._2_2_;
                  sVar187 = auVar333._4_2_;
                  sVar10 = auVar333._6_2_;
                  uVar83 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                    CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                             (0xff < sVar187),
                                             CONCAT11((0 < sVar155) * (sVar155 < 0x100) *
                                                      auVar333[2] - (0xff < sVar155),
                                                      (0 < sVar152) * (sVar152 < 0x100) *
                                                      auVar333[0] - (0xff < sVar152))));
                  sVar11 = auVar333._8_2_;
                  sVar12 = auVar333._10_2_;
                  sVar13 = auVar333._12_2_;
                  sVar14 = auVar333._14_2_;
                  auVar84._0_8_ =
                       CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14),
                                CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] -
                                         (0xff < sVar13),
                                         CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar333[10] -
                                                  (0xff < sVar12),
                                                  CONCAT14((0 < sVar11) * (sVar11 < 0x100) *
                                                           auVar333[8] - (0xff < sVar11),uVar83))));
                  auVar84[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[0] - (0xff < sVar152);
                  auVar84[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[2] - (0xff < sVar155);
                  auVar84[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar333[4] - (0xff < sVar187);
                  auVar84[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10);
                  auVar84[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                  auVar84[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                  auVar84[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13);
                  auVar84[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14);
                  if (p_width == 4) {
                    *(undefined4 *)(pred + iVar78) = uVar83;
                  }
                  else {
                    *(undefined8 *)(pred + iVar78) = auVar84._0_8_;
                  }
                }
                else {
                  iVar341 = conv_params->dst_stride * iVar50 + iVar75;
                  auVar84 = packusdw(auVar104,auVar104);
                  if (conv_params->do_average == 0) {
                    *(long *)(conv_params->dst + iVar341) = auVar84._0_8_;
                  }
                  else {
                    uVar5 = *(ulong *)(conv_params->dst + iVar341);
                    sVar187 = (short)(uVar5 >> 0x30);
                    sVar155 = (short)(uVar5 >> 0x20);
                    auVar167._0_2_ = (short)uVar5;
                    sVar152 = (short)(uVar5 >> 0x10);
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar106._0_2_ = auVar84._0_2_ + auVar167._0_2_;
                      auVar106._2_2_ = auVar84._2_2_ + sVar152;
                      auVar106._4_2_ = auVar84._4_2_ + sVar155;
                      auVar106._6_2_ = auVar84._6_2_ + sVar187;
                      auVar106._8_2_ = auVar84._8_2_;
                      auVar106._10_2_ = auVar84._10_2_;
                      auVar106._12_2_ = auVar84._12_2_;
                      auVar106._14_2_ = auVar84._14_2_;
                      auVar84 = psraw(auVar106,1);
                      auVar333 = auVar84;
                    }
                    else {
                      auVar170._8_4_ = 0;
                      auVar170._0_8_ = uVar5;
                      auVar170._12_2_ = sVar187;
                      auVar170._14_2_ = auVar84._6_2_;
                      auVar169._12_4_ = auVar170._12_4_;
                      auVar169._8_2_ = 0;
                      auVar169._0_8_ = uVar5;
                      auVar169._10_2_ = auVar84._4_2_;
                      auVar168._10_6_ = auVar169._10_6_;
                      auVar168._8_2_ = sVar155;
                      auVar168._0_8_ = uVar5;
                      auVar167._8_8_ = auVar168._8_8_;
                      auVar167._6_2_ = auVar84._2_2_;
                      auVar167._4_2_ = sVar152;
                      auVar167._2_2_ = auVar84._0_2_;
                      auVar26._4_4_ = uVar82;
                      auVar26._0_4_ = uVar82;
                      auVar26._8_4_ = uVar82;
                      auVar26._12_4_ = uVar82;
                      auVar333 = pmaddwd(auVar167,auVar26);
                      auVar171._0_4_ = auVar333._0_4_ >> 4;
                      auVar171._4_4_ = auVar333._4_4_ >> 4;
                      auVar171._8_4_ = auVar333._8_4_ >> 4;
                      auVar171._12_4_ = auVar333._12_4_ >> 4;
                      auVar333 = packusdw(auVar171,auVar171);
                    }
                    auVar172._0_2_ = auVar333._0_2_ + local_2d8;
                    auVar172._2_2_ = auVar333._2_2_ + sStack_2d6;
                    auVar172._4_2_ = auVar333._4_2_ + local_2d8;
                    auVar172._6_2_ = auVar333._6_2_ + sStack_2d6;
                    auVar172._8_2_ = auVar333._8_2_ + local_2d8;
                    auVar172._10_2_ = auVar333._10_2_ + sStack_2d6;
                    auVar172._12_2_ = auVar333._12_2_ + local_2d8;
                    auVar172._14_2_ = auVar333._14_2_ + sStack_2d6;
                    auVar333 = psraw(auVar172,auVar92);
                    sVar152 = auVar333._0_2_;
                    sVar155 = auVar333._2_2_;
                    sVar187 = auVar333._4_2_;
                    sVar10 = auVar333._6_2_;
                    *(uint *)(pred + iVar78) =
                         CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                  CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                           (0xff < sVar187),
                                           CONCAT11((0 < sVar155) * (sVar155 < 0x100) * auVar333[2]
                                                    - (0xff < sVar155),
                                                    (0 < sVar152) * (sVar152 < 0x100) * auVar333[0]
                                                    - (0xff < sVar152))));
                  }
                  if (4 < p_width) {
                    auVar209._0_4_ = iVar67 + iVar48 >> auVar91;
                    auVar209._4_4_ = iVar234 + iVar48 >> auVar91;
                    auVar209._8_4_ = iVar60 + iVar48 >> auVar91;
                    auVar209._12_4_ = iVar340 + iVar48 >> auVar91;
                    lVar53 = (long)(conv_params->dst_stride * iVar50 + iVar75);
                    in_XMM3 = packusdw(auVar209,auVar209);
                    if (conv_params->do_average == 0) {
                      *(long *)(conv_params->dst + lVar53 + 4) = in_XMM3._0_8_;
                    }
                    else {
                      uVar5 = *(ulong *)(conv_params->dst + lVar53 + 4);
                      sVar187 = (short)(uVar5 >> 0x30);
                      sVar155 = (short)(uVar5 >> 0x20);
                      auVar107._0_2_ = (short)uVar5;
                      sVar152 = (short)(uVar5 >> 0x10);
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar210._0_2_ = in_XMM3._0_2_ + auVar107._0_2_;
                        auVar210._2_2_ = in_XMM3._2_2_ + sVar152;
                        auVar210._4_2_ = in_XMM3._4_2_ + sVar155;
                        auVar210._6_2_ = in_XMM3._6_2_ + sVar187;
                        auVar210._8_2_ = in_XMM3._8_2_;
                        auVar210._10_2_ = in_XMM3._10_2_;
                        auVar210._12_2_ = in_XMM3._12_2_;
                        auVar210._14_2_ = in_XMM3._14_2_;
                        auVar84 = psraw(auVar210,1);
                        in_XMM3 = auVar84;
                      }
                      else {
                        auVar110._8_4_ = 0;
                        auVar110._0_8_ = uVar5;
                        auVar110._12_2_ = sVar187;
                        auVar110._14_2_ = in_XMM3._6_2_;
                        auVar109._12_4_ = auVar110._12_4_;
                        auVar109._8_2_ = 0;
                        auVar109._0_8_ = uVar5;
                        auVar109._10_2_ = in_XMM3._4_2_;
                        auVar108._10_6_ = auVar109._10_6_;
                        auVar108._8_2_ = sVar155;
                        auVar108._0_8_ = uVar5;
                        auVar107._8_8_ = auVar108._8_8_;
                        auVar107._6_2_ = in_XMM3._2_2_;
                        auVar107._4_2_ = sVar152;
                        auVar107._2_2_ = in_XMM3._0_2_;
                        auVar27._4_4_ = uVar82;
                        auVar27._0_4_ = uVar82;
                        auVar27._8_4_ = uVar82;
                        auVar27._12_4_ = uVar82;
                        auVar84 = pmaddwd(auVar107,auVar27);
                        auVar111._0_4_ = auVar84._0_4_ >> 4;
                        auVar111._4_4_ = auVar84._4_4_ >> 4;
                        auVar111._8_4_ = auVar84._8_4_ >> 4;
                        auVar111._12_4_ = auVar84._12_4_ >> 4;
                        auVar84 = packusdw(auVar111,auVar111);
                      }
                      auVar112._0_2_ = auVar84._0_2_ + local_2d8;
                      auVar112._2_2_ = auVar84._2_2_ + sStack_2d6;
                      auVar112._4_2_ = auVar84._4_2_ + local_2d8;
                      auVar112._6_2_ = auVar84._6_2_ + sStack_2d6;
                      auVar112._8_2_ = auVar84._8_2_ + local_2d8;
                      auVar112._10_2_ = auVar84._10_2_ + sStack_2d6;
                      auVar112._12_2_ = auVar84._12_2_ + local_2d8;
                      auVar112._14_2_ = auVar84._14_2_ + sStack_2d6;
                      auVar333 = psraw(auVar112,auVar92);
                      sVar152 = auVar333._0_2_;
                      sVar155 = auVar333._2_2_;
                      sVar187 = auVar333._4_2_;
                      sVar10 = auVar333._6_2_;
                      auVar84._0_4_ =
                           CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                    CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                             (0xff < sVar187),
                                             CONCAT11((0 < sVar155) * (sVar155 < 0x100) *
                                                      auVar333[2] - (0xff < sVar155),
                                                      (0 < sVar152) * (sVar152 < 0x100) *
                                                      auVar333[0] - (0xff < sVar152))));
                      sVar11 = auVar333._8_2_;
                      auVar84[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                      sVar12 = auVar333._10_2_;
                      auVar84[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                      sVar13 = auVar333._12_2_;
                      auVar84[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13)
                      ;
                      sVar14 = auVar333._14_2_;
                      auVar84[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14)
                      ;
                      auVar84[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[0] -
                                   (0xff < sVar152);
                      auVar84[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[2] -
                                   (0xff < sVar155);
                      auVar84[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                    (0xff < sVar187);
                      auVar84[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10)
                      ;
                      auVar84[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11)
                      ;
                      auVar84[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] -
                                     (0xff < sVar12);
                      auVar84[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] -
                                     (0xff < sVar13);
                      auVar84[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] -
                                     (0xff < sVar14);
                      *(undefined4 *)(pred + (long)iVar78 + 4) = auVar84._0_4_;
                    }
                  }
                }
                iVar78 = iVar78 + p_stride;
                iVar50 = iVar50 + 1;
                puVar54 = puVar54 + 8;
                uVar81 = uVar81 - 1;
              } while (uVar81 != 0);
            }
          }
          else if (gamma != 0 || delta == 0) {
            if (gamma != 0 && delta == 0) {
              if (0 < iVar65) {
                iVar67 = iVar50 + iVar80 >> 10;
                uVar83 = *(undefined4 *)av1_warped_filter[iVar67];
                uVar18 = *(undefined4 *)(av1_warped_filter[iVar67] + 4);
                aWVar6 = av1_warped_filter[iVar80 * 3 + iVar50 >> 10];
                iVar60 = iVar80 * 5 + iVar50 >> 10;
                uVar21 = *(undefined4 *)(av1_warped_filter[iVar60] + 2);
                uVar22 = *(undefined4 *)(av1_warped_filter[iVar60] + 4);
                iVar234 = iVar80 * 7 + iVar50 >> 10;
                uVar19 = *(undefined4 *)(av1_warped_filter[iVar234] + 2);
                uVar20 = *(undefined4 *)(av1_warped_filter[iVar234] + 4);
                auVar15._4_8_ = aWVar6._8_8_;
                auVar15._0_4_ = aWVar6._0_4_;
                auVar113._0_8_ = auVar15._0_8_ << 0x20;
                auVar113._8_4_ = *(undefined4 *)(av1_warped_filter[iVar67] + 2);
                auVar113._12_4_ = aWVar6._4_4_;
                WStack_2d4 = aWVar6[0];
                WStack_2d2 = aWVar6[1];
                uStack_2d0 = (undefined2)*(undefined4 *)av1_warped_filter[iVar60];
                uStack_2ce = (undefined2)((uint)*(undefined4 *)av1_warped_filter[iVar60] >> 0x10);
                uStack_2cc = (undefined2)*(undefined4 *)av1_warped_filter[iVar234];
                uStack_2ca = (undefined2)((uint)*(undefined4 *)av1_warped_filter[iVar234] >> 0x10);
                aWVar7 = av1_warped_filter[iVar78];
                iVar67 = iVar80 * 2 + iVar50 >> 10;
                auVar348._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar67] + 4),aWVar7._8_4_);
                auVar348._8_4_ = aWVar7._12_4_;
                auVar348._12_4_ = *(undefined4 *)(av1_warped_filter[iVar67] + 6);
                aWVar8 = av1_warped_filter[iVar80 * 4 + iVar50 >> 10];
                iVar78 = iVar50 + iVar80 * 6 >> 10;
                auVar211._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar78] + 4),aWVar8._8_4_);
                auVar211._8_4_ = aWVar8._12_4_;
                auVar211._12_4_ = *(undefined4 *)(av1_warped_filter[iVar78] + 6);
                auVar360._8_8_ = auVar211._8_8_;
                auVar360._0_8_ = auVar348._8_8_;
                auVar349._8_8_ = auVar211._0_8_;
                auVar349._0_8_ = auVar348._0_8_;
                auVar267._0_8_ = aWVar7._0_8_;
                auVar267._8_4_ = aWVar7._4_4_;
                auVar267._12_4_ = *(undefined4 *)(av1_warped_filter[iVar67] + 2);
                in_XMM5._0_4_ = aWVar7._0_4_;
                in_XMM5._4_4_ = *(undefined4 *)av1_warped_filter[iVar67];
                auVar114._0_8_ = aWVar8._0_8_;
                auVar114._8_4_ = aWVar8._4_4_;
                auVar114._12_4_ = *(undefined4 *)(av1_warped_filter[iVar78] + 2);
                in_XMM5._12_4_ = *(undefined4 *)av1_warped_filter[iVar78];
                in_XMM5._8_4_ = aWVar8._0_4_;
                bVar16 = local_32c - (char)*local_2e8;
                auVar338._8_8_ = auVar114._8_8_;
                auVar338._0_8_ = auVar267._8_8_;
                auVar84 = ZEXT416((-1 << (bVar16 & 0x1f)) + uVar49 + (-1 << (bVar16 - 1 & 0x1f)));
                auVar333 = pshuflw(auVar84,auVar84,0);
                puVar54 = local_b8;
                uVar81 = uVar62;
                iVar78 = local_328;
                iVar50 = iVar61;
                do {
                  auVar84 = *(undefined1 (*) [16])(puVar54 + -0x38);
                  auVar336 = *(undefined1 (*) [16])(puVar54 + -0x28);
                  auVar118._0_12_ = auVar84._0_12_;
                  auVar118._12_2_ = auVar84._6_2_;
                  auVar118._14_2_ = puVar54[-0x2d];
                  auVar117._12_4_ = auVar118._12_4_;
                  auVar117._0_10_ = auVar84._0_10_;
                  auVar117._10_2_ = puVar54[-0x2e];
                  auVar116._10_6_ = auVar117._10_6_;
                  auVar116._0_8_ = auVar84._0_8_;
                  auVar116._8_2_ = auVar84._4_2_;
                  auVar115._8_8_ = auVar116._8_8_;
                  auVar115._6_2_ = puVar54[-0x2f];
                  auVar115._4_2_ = auVar84._2_2_;
                  auVar115._0_2_ = auVar84._0_2_;
                  auVar115._2_2_ = puVar54[-0x30];
                  auVar281 = pmaddwd(auVar115,in_XMM5);
                  auVar245._0_12_ = auVar336._0_12_;
                  auVar245._12_2_ = auVar336._6_2_;
                  auVar245._14_2_ = puVar54[-0x1d];
                  auVar244._12_4_ = auVar245._12_4_;
                  auVar244._0_10_ = auVar336._0_10_;
                  auVar244._10_2_ = puVar54[-0x1e];
                  auVar243._10_6_ = auVar244._10_6_;
                  auVar243._0_8_ = auVar336._0_8_;
                  auVar243._8_2_ = auVar336._4_2_;
                  auVar242._8_8_ = auVar243._8_8_;
                  auVar242._6_2_ = puVar54[-0x1f];
                  auVar242._4_2_ = auVar336._2_2_;
                  auVar242._0_2_ = auVar336._0_2_;
                  auVar242._2_2_ = puVar54[-0x20];
                  auVar246 = pmaddwd(auVar242,auVar338);
                  auVar343 = *(undefined1 (*) [16])(puVar54 + -0x18);
                  auVar193 = *(undefined1 (*) [16])(puVar54 + -0x10);
                  auVar285._0_12_ = auVar343._0_12_;
                  auVar285._12_2_ = auVar343._6_2_;
                  auVar285._14_2_ = auVar193._6_2_;
                  auVar284._12_4_ = auVar285._12_4_;
                  auVar284._0_10_ = auVar343._0_10_;
                  auVar284._10_2_ = auVar193._4_2_;
                  auVar283._10_6_ = auVar284._10_6_;
                  auVar283._0_8_ = auVar343._0_8_;
                  auVar283._8_2_ = auVar343._4_2_;
                  auVar282._8_8_ = auVar283._8_8_;
                  auVar282._6_2_ = auVar193._2_2_;
                  auVar282._4_2_ = auVar343._2_2_;
                  auVar282._0_2_ = auVar343._0_2_;
                  auVar282._2_2_ = auVar193._0_2_;
                  auVar286 = pmaddwd(auVar282,auVar349);
                  auVar198 = *(undefined1 (*) [16])(puVar54 + -8);
                  auVar215._0_12_ = auVar198._0_12_;
                  auVar215._12_2_ = auVar198._6_2_;
                  auVar215._14_2_ = puVar54[3];
                  auVar214._12_4_ = auVar215._12_4_;
                  auVar214._0_10_ = auVar198._0_10_;
                  auVar214._10_2_ = puVar54[2];
                  auVar213._10_6_ = auVar214._10_6_;
                  auVar213._0_8_ = auVar198._0_8_;
                  auVar213._8_2_ = auVar198._4_2_;
                  auVar212._8_8_ = auVar213._8_8_;
                  auVar212._6_2_ = puVar54[1];
                  auVar212._4_2_ = auVar198._2_2_;
                  auVar212._0_2_ = auVar198._0_2_;
                  auVar212._2_2_ = *puVar54;
                  auVar355 = pmaddwd(auVar212,auVar360);
                  iVar67 = auVar355._8_4_ + auVar286._8_4_ + auVar246._8_4_ + auVar281._8_4_;
                  iVar60 = auVar355._12_4_ + auVar286._12_4_ + auVar246._12_4_ + auVar281._12_4_;
                  auVar173._2_2_ = puVar54[-0x2c];
                  auVar173._0_2_ = auVar84._8_2_;
                  auVar173._4_2_ = auVar84._10_2_;
                  auVar173._6_2_ = puVar54[-0x2b];
                  auVar173._8_2_ = auVar84._12_2_;
                  auVar173._10_2_ = puVar54[-0x2a];
                  auVar173._12_2_ = auVar84._14_2_;
                  auVar173._14_2_ = puVar54[-0x29];
                  auVar325._2_2_ = puVar54[-0x1c];
                  auVar325._0_2_ = auVar336._8_2_;
                  auVar325._4_2_ = auVar336._10_2_;
                  auVar325._6_2_ = puVar54[-0x1b];
                  auVar325._8_2_ = auVar336._12_2_;
                  auVar325._10_2_ = puVar54[-0x1a];
                  auVar325._12_2_ = auVar336._14_2_;
                  auVar325._14_2_ = puVar54[-0x19];
                  auVar23._4_2_ = WStack_2d4;
                  auVar23._0_4_ = uVar83;
                  auVar23._6_2_ = WStack_2d2;
                  auVar23._8_2_ = uStack_2d0;
                  auVar23._10_2_ = uStack_2ce;
                  auVar23._12_2_ = uStack_2cc;
                  auVar23._14_2_ = uStack_2ca;
                  auVar336 = pmaddwd(auVar173,auVar23);
                  auVar32._8_8_ = uStack_150;
                  auVar32._0_8_ = auVar113._8_8_;
                  auVar326 = pmaddwd(auVar325,auVar32);
                  auVar317._2_2_ = auVar193._8_2_;
                  auVar317._0_2_ = auVar343._8_2_;
                  auVar317._4_2_ = auVar343._10_2_;
                  auVar317._6_2_ = auVar193._10_2_;
                  auVar317._8_2_ = auVar343._12_2_;
                  auVar317._10_2_ = auVar193._12_2_;
                  auVar317._12_2_ = auVar343._14_2_;
                  auVar317._14_2_ = auVar193._14_2_;
                  auVar119._2_2_ = puVar54[4];
                  auVar119._0_2_ = auVar198._8_2_;
                  auVar119._4_2_ = auVar198._10_2_;
                  auVar119._6_2_ = puVar54[5];
                  auVar119._8_2_ = auVar198._12_2_;
                  auVar119._10_2_ = puVar54[6];
                  auVar119._12_2_ = auVar198._14_2_;
                  auVar119._14_2_ = puVar54[7];
                  auVar34._4_4_ = aWVar6._8_4_;
                  auVar34._0_4_ = uVar18;
                  auVar34._8_4_ = uVar22;
                  auVar34._12_4_ = uVar20;
                  auVar343 = pmaddwd(auVar317,auVar34);
                  auVar33._4_4_ = uVar19;
                  auVar33._0_4_ = uVar21;
                  auVar33._8_8_ = uStack_140;
                  auVar84 = pmaddwd(auVar119,auVar33);
                  auVar120._0_4_ = auVar84._0_4_ + auVar343._0_4_ + auVar326._0_4_ + auVar336._0_4_;
                  auVar120._4_4_ = auVar84._4_4_ + auVar343._4_4_ + auVar326._4_4_ + auVar336._4_4_;
                  auVar120._8_4_ = auVar84._8_4_ + auVar343._8_4_ + auVar326._8_4_ + auVar336._8_4_;
                  auVar120._12_4_ =
                       auVar84._12_4_ + auVar343._12_4_ + auVar326._12_4_ + auVar336._12_4_;
                  in_XMM3._4_4_ = auVar120._8_4_;
                  in_XMM3._0_4_ = iVar67;
                  in_XMM3._8_4_ = iVar60;
                  in_XMM3._12_4_ = auVar120._12_4_;
                  auVar247._0_4_ =
                       auVar355._0_4_ + auVar286._0_4_ + auVar246._0_4_ + auVar281._0_4_ + iVar48 >>
                       auVar91;
                  auVar247._4_4_ = auVar120._0_4_ + iVar48 >> auVar91;
                  auVar247._8_4_ =
                       auVar355._4_4_ + auVar286._4_4_ + auVar246._4_4_ + auVar281._4_4_ + iVar48 >>
                       auVar91;
                  auVar247._12_4_ = auVar120._4_4_ + iVar48 >> auVar91;
                  if (conv_params->is_compound == 0) {
                    auVar248._4_4_ = auVar247._4_4_;
                    auVar248._0_4_ = auVar247._0_4_;
                    auVar248._8_4_ = auVar247._8_4_;
                    auVar248._12_4_ = auVar247._12_4_;
                    in_XMM3._0_4_ = iVar67 + iVar48 >> auVar91;
                    in_XMM3._4_4_ = auVar120._8_4_ + iVar48 >> auVar91;
                    in_XMM3._8_4_ = iVar60 + iVar48 >> auVar91;
                    in_XMM3._12_4_ = auVar120._12_4_ + iVar48 >> auVar91;
                    auVar84 = packssdw(auVar248,in_XMM3);
                    sVar152 = auVar84._0_2_;
                    sVar155 = auVar84._2_2_;
                    sVar187 = auVar84._4_2_;
                    sVar10 = auVar84._6_2_;
                    uVar235 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar84[6] -
                                       (0xff < sVar10),
                                       CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar84[4] -
                                                (0xff < sVar187),
                                                CONCAT11((0 < sVar155) * (sVar155 < 0x100) *
                                                         auVar84[2] - (0xff < sVar155),
                                                         (0 < sVar152) * (sVar152 < 0x100) *
                                                         auVar84[0] - (0xff < sVar152))));
                    sVar11 = auVar84._8_2_;
                    sVar12 = auVar84._10_2_;
                    sVar13 = auVar84._12_2_;
                    sVar14 = auVar84._14_2_;
                    in_XMM4._0_8_ =
                         CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar84[0xe] - (0xff < sVar14),
                                  CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar84[0xc] -
                                           (0xff < sVar13),
                                           CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar84[10] -
                                                    (0xff < sVar12),
                                                    CONCAT14((0 < sVar11) * (sVar11 < 0x100) *
                                                             auVar84[8] - (0xff < sVar11),uVar235)))
                                 );
                    in_XMM4[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar84[0] - (0xff < sVar152);
                    in_XMM4[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar84[2] - (0xff < sVar155);
                    in_XMM4[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar84[4] - (0xff < sVar187);
                    in_XMM4[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar84[6] - (0xff < sVar10);
                    in_XMM4[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar84[8] - (0xff < sVar11);
                    in_XMM4[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar84[10] - (0xff < sVar12);
                    in_XMM4[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar84[0xc] - (0xff < sVar13);
                    in_XMM4[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar84[0xe] - (0xff < sVar14);
                    auVar84 = auVar91;
                    if (p_width == 4) {
                      *(undefined4 *)(pred + iVar78) = uVar235;
                    }
                    else {
                      *(undefined8 *)(pred + iVar78) = in_XMM4._0_8_;
                    }
                  }
                  else {
                    iVar234 = conv_params->dst_stride * iVar50 + iVar75;
                    in_XMM4 = packusdw(auVar247,auVar247);
                    local_188 = auVar333._0_2_;
                    sStack_186 = auVar333._2_2_;
                    if (conv_params->do_average == 0) {
                      *(long *)(conv_params->dst + iVar234) = in_XMM4._0_8_;
                      auVar84 = auVar120;
                    }
                    else {
                      uVar5 = *(ulong *)(conv_params->dst + iVar234);
                      sVar187 = (short)(uVar5 >> 0x30);
                      sVar155 = (short)(uVar5 >> 0x20);
                      auVar121._0_2_ = (short)uVar5;
                      sVar152 = (short)(uVar5 >> 0x10);
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar249._0_2_ = in_XMM4._0_2_ + auVar121._0_2_;
                        auVar249._2_2_ = in_XMM4._2_2_ + sVar152;
                        auVar249._4_2_ = in_XMM4._4_2_ + sVar155;
                        auVar249._6_2_ = in_XMM4._6_2_ + sVar187;
                        auVar249._8_2_ = in_XMM4._8_2_;
                        auVar249._10_2_ = in_XMM4._10_2_;
                        auVar249._12_2_ = in_XMM4._12_2_;
                        auVar249._14_2_ = in_XMM4._14_2_;
                        auVar84 = psraw(auVar249,1);
                        in_XMM4 = auVar84;
                      }
                      else {
                        auVar124._8_4_ = 0;
                        auVar124._0_8_ = uVar5;
                        auVar124._12_2_ = sVar187;
                        auVar124._14_2_ = in_XMM4._6_2_;
                        auVar123._12_4_ = auVar124._12_4_;
                        auVar123._8_2_ = 0;
                        auVar123._0_8_ = uVar5;
                        auVar123._10_2_ = in_XMM4._4_2_;
                        auVar122._10_6_ = auVar123._10_6_;
                        auVar122._8_2_ = sVar155;
                        auVar122._0_8_ = uVar5;
                        auVar121._8_8_ = auVar122._8_8_;
                        auVar121._6_2_ = in_XMM4._2_2_;
                        auVar121._4_2_ = sVar152;
                        auVar121._2_2_ = in_XMM4._0_2_;
                        auVar28._4_4_ = uVar82;
                        auVar28._0_4_ = uVar82;
                        auVar28._8_4_ = uVar82;
                        auVar28._12_4_ = uVar82;
                        auVar84 = pmaddwd(auVar121,auVar28);
                        auVar125._0_4_ = auVar84._0_4_ >> 4;
                        auVar125._4_4_ = auVar84._4_4_ >> 4;
                        auVar125._8_4_ = auVar84._8_4_ >> 4;
                        auVar125._12_4_ = auVar84._12_4_ >> 4;
                        auVar84 = packusdw(auVar125,auVar125);
                      }
                      auVar126._0_2_ = auVar84._0_2_ + local_188;
                      auVar126._2_2_ = auVar84._2_2_ + sStack_186;
                      auVar126._4_2_ = auVar84._4_2_ + local_188;
                      auVar126._6_2_ = auVar84._6_2_ + sStack_186;
                      auVar126._8_2_ = auVar84._8_2_ + local_188;
                      auVar126._10_2_ = auVar84._10_2_ + sStack_186;
                      auVar126._12_2_ = auVar84._12_2_ + local_188;
                      auVar126._14_2_ = auVar84._14_2_ + sStack_186;
                      auVar336 = psraw(auVar126,auVar92);
                      sVar152 = auVar336._0_2_;
                      sVar155 = auVar336._2_2_;
                      sVar187 = auVar336._4_2_;
                      sVar10 = auVar336._6_2_;
                      auVar84._0_4_ =
                           CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar336[6] - (0xff < sVar10),
                                    CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar336[4] -
                                             (0xff < sVar187),
                                             CONCAT11((0 < sVar155) * (sVar155 < 0x100) *
                                                      auVar336[2] - (0xff < sVar155),
                                                      (0 < sVar152) * (sVar152 < 0x100) *
                                                      auVar336[0] - (0xff < sVar152))));
                      sVar11 = auVar336._8_2_;
                      auVar84[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar336[8] - (0xff < sVar11);
                      sVar12 = auVar336._10_2_;
                      auVar84[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar336[10] - (0xff < sVar12);
                      sVar13 = auVar336._12_2_;
                      auVar84[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar336[0xc] - (0xff < sVar13)
                      ;
                      sVar14 = auVar336._14_2_;
                      auVar84[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar336[0xe] - (0xff < sVar14)
                      ;
                      auVar84[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar336[0] -
                                   (0xff < sVar152);
                      auVar84[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar336[2] -
                                   (0xff < sVar155);
                      auVar84[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar336[4] -
                                    (0xff < sVar187);
                      auVar84[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar336[6] - (0xff < sVar10)
                      ;
                      auVar84[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar336[8] - (0xff < sVar11)
                      ;
                      auVar84[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar336[10] -
                                     (0xff < sVar12);
                      auVar84[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar336[0xc] -
                                     (0xff < sVar13);
                      auVar84[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar336[0xe] -
                                     (0xff < sVar14);
                      *(undefined4 *)(pred + iVar78) = auVar84._0_4_;
                    }
                    if (4 < p_width) {
                      auVar216._0_4_ = iVar67 + iVar48 >> auVar91;
                      auVar216._4_4_ = auVar120._8_4_ + iVar48 >> auVar91;
                      auVar216._8_4_ = iVar60 + iVar48 >> auVar91;
                      auVar216._12_4_ = auVar120._12_4_ + iVar48 >> auVar91;
                      lVar53 = (long)(conv_params->dst_stride * iVar50 + iVar75);
                      in_XMM3 = packusdw(auVar216,auVar216);
                      if (conv_params->do_average == 0) {
                        *(long *)(conv_params->dst + lVar53 + 4) = in_XMM3._0_8_;
                      }
                      else {
                        uVar5 = *(ulong *)(conv_params->dst + lVar53 + 4);
                        sVar187 = (short)(uVar5 >> 0x30);
                        sVar155 = (short)(uVar5 >> 0x20);
                        auVar127._0_2_ = (short)uVar5;
                        sVar152 = (short)(uVar5 >> 0x10);
                        if (conv_params->use_dist_wtd_comp_avg == 0) {
                          auVar217._0_2_ = in_XMM3._0_2_ + auVar127._0_2_;
                          auVar217._2_2_ = in_XMM3._2_2_ + sVar152;
                          auVar217._4_2_ = in_XMM3._4_2_ + sVar155;
                          auVar217._6_2_ = in_XMM3._6_2_ + sVar187;
                          auVar217._8_2_ = in_XMM3._8_2_;
                          auVar217._10_2_ = in_XMM3._10_2_;
                          auVar217._12_2_ = in_XMM3._12_2_;
                          auVar217._14_2_ = in_XMM3._14_2_;
                          auVar84 = psraw(auVar217,1);
                          in_XMM3 = auVar84;
                        }
                        else {
                          auVar130._8_4_ = 0;
                          auVar130._0_8_ = uVar5;
                          auVar130._12_2_ = sVar187;
                          auVar130._14_2_ = in_XMM3._6_2_;
                          auVar129._12_4_ = auVar130._12_4_;
                          auVar129._8_2_ = 0;
                          auVar129._0_8_ = uVar5;
                          auVar129._10_2_ = in_XMM3._4_2_;
                          auVar128._10_6_ = auVar129._10_6_;
                          auVar128._8_2_ = sVar155;
                          auVar128._0_8_ = uVar5;
                          auVar127._8_8_ = auVar128._8_8_;
                          auVar127._6_2_ = in_XMM3._2_2_;
                          auVar127._4_2_ = sVar152;
                          auVar127._2_2_ = in_XMM3._0_2_;
                          auVar29._4_4_ = uVar82;
                          auVar29._0_4_ = uVar82;
                          auVar29._8_4_ = uVar82;
                          auVar29._12_4_ = uVar82;
                          auVar84 = pmaddwd(auVar127,auVar29);
                          auVar131._0_4_ = auVar84._0_4_ >> 4;
                          auVar131._4_4_ = auVar84._4_4_ >> 4;
                          auVar131._8_4_ = auVar84._8_4_ >> 4;
                          auVar131._12_4_ = auVar84._12_4_ >> 4;
                          auVar84 = packusdw(auVar131,auVar131);
                        }
                        auVar132._0_2_ = auVar84._0_2_ + local_188;
                        auVar132._2_2_ = auVar84._2_2_ + sStack_186;
                        auVar132._4_2_ = auVar84._4_2_ + local_188;
                        auVar132._6_2_ = auVar84._6_2_ + sStack_186;
                        auVar132._8_2_ = auVar84._8_2_ + local_188;
                        auVar132._10_2_ = auVar84._10_2_ + sStack_186;
                        auVar132._12_2_ = auVar84._12_2_ + local_188;
                        auVar132._14_2_ = auVar84._14_2_ + sStack_186;
                        auVar336 = psraw(auVar132,auVar92);
                        sVar152 = auVar336._0_2_;
                        sVar155 = auVar336._2_2_;
                        sVar187 = auVar336._4_2_;
                        sVar10 = auVar336._6_2_;
                        auVar84._0_4_ =
                             CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar336[6] -
                                      (0xff < sVar10),
                                      CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar336[4] -
                                               (0xff < sVar187),
                                               CONCAT11((0 < sVar155) * (sVar155 < 0x100) *
                                                        auVar336[2] - (0xff < sVar155),
                                                        (0 < sVar152) * (sVar152 < 0x100) *
                                                        auVar336[0] - (0xff < sVar152))));
                        sVar11 = auVar336._8_2_;
                        auVar84[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar336[8] - (0xff < sVar11)
                        ;
                        sVar12 = auVar336._10_2_;
                        auVar84[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar336[10] -
                                     (0xff < sVar12);
                        sVar13 = auVar336._12_2_;
                        auVar84[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar336[0xc] -
                                     (0xff < sVar13);
                        sVar14 = auVar336._14_2_;
                        auVar84[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar336[0xe] -
                                     (0xff < sVar14);
                        auVar84[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar336[0] -
                                     (0xff < sVar152);
                        auVar84[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar336[2] -
                                     (0xff < sVar155);
                        auVar84[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar336[4] -
                                      (0xff < sVar187);
                        auVar84[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar336[6] -
                                       (0xff < sVar10);
                        auVar84[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar336[8] -
                                       (0xff < sVar11);
                        auVar84[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar336[10] -
                                       (0xff < sVar12);
                        auVar84[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar336[0xc] -
                                       (0xff < sVar13);
                        auVar84[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar336[0xe] -
                                       (0xff < sVar14);
                        *(undefined4 *)(pred + (long)iVar78 + 4) = auVar84._0_4_;
                      }
                    }
                  }
                  iVar78 = iVar78 + p_stride;
                  iVar50 = iVar50 + 1;
                  puVar54 = puVar54 + 8;
                  uVar81 = uVar81 - 1;
                } while (uVar81 != 0);
              }
            }
            else if (0 < iVar65) {
              bVar16 = local_32c - (char)*local_2e8;
              auVar84 = ZEXT416((-1 << (bVar16 & 0x1f)) + uVar49 + (-1 << (bVar16 - 1 & 0x1f)));
              auVar84 = pshuflw(auVar84,auVar84,0);
              local_2d8 = auVar84._0_2_;
              sStack_2d6 = auVar84._2_2_;
              puVar54 = local_b8;
              uVar81 = uVar62;
              iVar78 = local_328;
              iVar67 = iVar61;
              do {
                aWVar6 = av1_warped_filter[iVar50 >> 10];
                iVar60 = iVar80 * 2 + iVar50 >> 10;
                aWVar7 = av1_warped_filter[iVar80 * 4 + iVar50 >> 10];
                iVar234 = iVar80 * 6 + iVar50 >> 10;
                auVar218._0_8_ = aWVar6._0_8_;
                auVar218._8_4_ = aWVar6._4_4_;
                auVar218._12_4_ = *(undefined4 *)(av1_warped_filter[iVar60] + 2);
                auVar327._4_4_ = *(undefined4 *)av1_warped_filter[iVar60];
                auVar327._0_4_ = aWVar6._0_4_;
                auVar268._0_8_ = aWVar7._0_8_;
                auVar268._8_4_ = aWVar7._4_4_;
                auVar268._12_4_ = *(undefined4 *)(av1_warped_filter[iVar234] + 2);
                auVar327._12_4_ = *(undefined4 *)av1_warped_filter[iVar234];
                auVar327._8_4_ = aWVar7._0_4_;
                auVar250._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar60] + 4),aWVar6._8_4_);
                auVar250._8_4_ = aWVar6._12_4_;
                auVar250._12_4_ = *(undefined4 *)(av1_warped_filter[iVar60] + 6);
                auVar154._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar234] + 4),aWVar7._8_4_);
                auVar154._8_4_ = aWVar7._12_4_;
                auVar154._12_4_ = *(undefined4 *)(av1_warped_filter[iVar234] + 6);
                auVar219._8_8_ = auVar268._8_8_;
                auVar219._0_8_ = auVar218._8_8_;
                auVar318._8_8_ = auVar154._0_8_;
                auVar318._0_8_ = auVar250._0_8_;
                auVar251._8_8_ = auVar154._8_8_;
                auVar251._0_8_ = auVar250._8_8_;
                aWVar6 = av1_warped_filter[iVar80 + iVar50 >> 10];
                iVar60 = iVar80 * 3 + iVar50 >> 10;
                aWVar7 = av1_warped_filter[iVar80 * 5 + iVar50 >> 10];
                iVar234 = iVar80 * 7 + iVar50 >> 10;
                auVar133._0_8_ = aWVar6._0_8_;
                auVar133._8_4_ = aWVar6._4_4_;
                auVar133._12_4_ = *(undefined4 *)(av1_warped_filter[iVar60] + 2);
                auVar350._4_4_ = *(undefined4 *)av1_warped_filter[iVar60];
                auVar350._0_4_ = aWVar6._0_4_;
                auVar307._0_8_ = aWVar7._0_8_;
                auVar307._8_4_ = aWVar7._4_4_;
                auVar307._12_4_ = *(undefined4 *)(av1_warped_filter[iVar234] + 2);
                auVar350._12_4_ = *(undefined4 *)av1_warped_filter[iVar234];
                auVar350._8_4_ = aWVar7._0_4_;
                auVar269._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar60] + 4),aWVar6._8_4_);
                auVar269._8_4_ = aWVar6._12_4_;
                auVar269._12_4_ = *(undefined4 *)(av1_warped_filter[iVar60] + 6);
                auVar174._0_8_ =
                     CONCAT44(*(undefined4 *)(av1_warped_filter[iVar234] + 4),aWVar7._8_4_);
                auVar174._8_4_ = aWVar7._12_4_;
                auVar174._12_4_ = *(undefined4 *)(av1_warped_filter[iVar234] + 6);
                auVar84._8_8_ = auVar307._8_8_;
                auVar84._0_8_ = auVar133._8_8_;
                auVar339._8_8_ = auVar174._0_8_;
                auVar339._0_8_ = auVar269._0_8_;
                in_XMM5._8_8_ = auVar174._8_8_;
                in_XMM5._0_8_ = auVar269._8_8_;
                auVar333 = *(undefined1 (*) [16])(puVar54 + -0x38);
                auVar336 = *(undefined1 (*) [16])(puVar54 + -0x28);
                auVar290._0_12_ = auVar333._0_12_;
                auVar290._12_2_ = auVar333._6_2_;
                auVar290._14_2_ = puVar54[-0x2d];
                auVar289._12_4_ = auVar290._12_4_;
                auVar289._0_10_ = auVar333._0_10_;
                auVar289._10_2_ = puVar54[-0x2e];
                auVar288._10_6_ = auVar289._10_6_;
                auVar288._0_8_ = auVar333._0_8_;
                auVar288._8_2_ = auVar333._4_2_;
                auVar287._8_8_ = auVar288._8_8_;
                auVar287._6_2_ = puVar54[-0x2f];
                auVar287._4_2_ = auVar333._2_2_;
                auVar287._0_2_ = auVar333._0_2_;
                auVar287._2_2_ = puVar54[-0x30];
                auVar281 = pmaddwd(auVar287,auVar327);
                auVar331._0_12_ = auVar336._0_12_;
                auVar331._12_2_ = auVar336._6_2_;
                auVar331._14_2_ = puVar54[-0x1d];
                auVar330._12_4_ = auVar331._12_4_;
                auVar330._0_10_ = auVar336._0_10_;
                auVar330._10_2_ = puVar54[-0x1e];
                auVar329._10_6_ = auVar330._10_6_;
                auVar329._0_8_ = auVar336._0_8_;
                auVar329._8_2_ = auVar336._4_2_;
                auVar328._8_8_ = auVar329._8_8_;
                auVar328._6_2_ = puVar54[-0x1f];
                auVar328._4_2_ = auVar336._2_2_;
                auVar328._0_2_ = auVar336._0_2_;
                auVar328._2_2_ = puVar54[-0x20];
                auVar246 = pmaddwd(auVar328,auVar219);
                auVar343 = *(undefined1 (*) [16])(puVar54 + -0x18);
                auVar294._0_12_ = auVar343._0_12_;
                auVar294._12_2_ = auVar343._6_2_;
                auVar294._14_2_ = puVar54[-0xd];
                auVar293._12_4_ = auVar294._12_4_;
                auVar293._0_10_ = auVar343._0_10_;
                auVar293._10_2_ = puVar54[-0xe];
                auVar292._10_6_ = auVar293._10_6_;
                auVar292._0_8_ = auVar343._0_8_;
                auVar292._8_2_ = auVar343._4_2_;
                auVar291._8_8_ = auVar292._8_8_;
                auVar291._6_2_ = puVar54[-0xf];
                auVar291._4_2_ = auVar343._2_2_;
                auVar291._0_2_ = auVar343._0_2_;
                auVar291._2_2_ = puVar54[-0x10];
                auVar355 = pmaddwd(auVar291,auVar318);
                auVar193 = *(undefined1 (*) [16])(puVar54 + -8);
                auVar223._0_12_ = auVar193._0_12_;
                auVar223._12_2_ = auVar193._6_2_;
                auVar223._14_2_ = puVar54[3];
                auVar222._12_4_ = auVar223._12_4_;
                auVar222._0_10_ = auVar193._0_10_;
                auVar222._10_2_ = puVar54[2];
                auVar221._10_6_ = auVar222._10_6_;
                auVar221._0_8_ = auVar193._0_8_;
                auVar221._8_2_ = auVar193._4_2_;
                auVar220._8_8_ = auVar221._8_8_;
                auVar220._6_2_ = puVar54[1];
                auVar220._4_2_ = auVar193._2_2_;
                auVar220._0_2_ = auVar193._0_2_;
                auVar220._2_2_ = *puVar54;
                auVar198 = pmaddwd(auVar220,auVar251);
                iVar60 = auVar198._0_4_ + auVar355._0_4_ + auVar246._0_4_ + auVar281._0_4_;
                iVar234 = auVar198._4_4_ + auVar355._4_4_ + auVar246._4_4_ + auVar281._4_4_;
                iVar340 = auVar198._8_4_ + auVar355._8_4_ + auVar246._8_4_ + auVar281._8_4_;
                iVar341 = auVar198._12_4_ + auVar355._12_4_ + auVar246._12_4_ + auVar281._12_4_;
                auVar175._2_2_ = puVar54[-0x2c];
                auVar175._0_2_ = auVar333._8_2_;
                auVar175._4_2_ = auVar333._10_2_;
                auVar175._6_2_ = puVar54[-0x2b];
                auVar175._8_2_ = auVar333._12_2_;
                auVar175._10_2_ = puVar54[-0x2a];
                auVar175._12_2_ = auVar333._14_2_;
                auVar175._14_2_ = puVar54[-0x29];
                auVar333 = pmaddwd(auVar175,auVar350);
                auVar334._2_2_ = puVar54[-0x1c];
                auVar334._0_2_ = auVar336._8_2_;
                auVar334._4_2_ = auVar336._10_2_;
                auVar334._6_2_ = puVar54[-0x1b];
                auVar334._8_2_ = auVar336._12_2_;
                auVar334._10_2_ = puVar54[-0x1a];
                auVar334._12_2_ = auVar336._14_2_;
                auVar334._14_2_ = puVar54[-0x19];
                auVar198 = pmaddwd(auVar334,auVar84);
                auVar313._2_2_ = puVar54[-0xc];
                auVar313._0_2_ = auVar343._8_2_;
                auVar313._4_2_ = auVar343._10_2_;
                auVar313._6_2_ = puVar54[-0xb];
                auVar313._8_2_ = auVar343._12_2_;
                auVar313._10_2_ = puVar54[-10];
                auVar313._12_2_ = auVar343._14_2_;
                auVar313._14_2_ = puVar54[-9];
                auVar336 = pmaddwd(auVar313,auVar339);
                auVar319._2_2_ = puVar54[4];
                auVar319._0_2_ = auVar193._8_2_;
                auVar319._4_2_ = auVar193._10_2_;
                auVar319._6_2_ = puVar54[5];
                auVar319._8_2_ = auVar193._12_2_;
                auVar319._10_2_ = puVar54[6];
                auVar319._12_2_ = auVar193._14_2_;
                auVar319._14_2_ = puVar54[7];
                auVar343 = pmaddwd(auVar319,in_XMM5);
                iVar69 = auVar343._0_4_ + auVar336._0_4_ + auVar198._0_4_ + auVar333._0_4_;
                iVar320 = auVar343._4_4_ + auVar336._4_4_ + auVar198._4_4_ + auVar333._4_4_;
                iVar321 = auVar343._8_4_ + auVar336._8_4_ + auVar198._8_4_ + auVar333._8_4_;
                iVar322 = auVar343._12_4_ + auVar336._12_4_ + auVar198._12_4_ + auVar333._12_4_;
                in_XMM3._4_4_ = iVar321;
                in_XMM3._0_4_ = iVar340;
                in_XMM3._8_4_ = iVar341;
                in_XMM3._12_4_ = iVar322;
                if (conv_params->is_compound == 0) {
                  auVar84._4_4_ = iVar48;
                  auVar84._0_4_ = iVar48;
                  auVar84._8_4_ = iVar48;
                  auVar84._12_4_ = iVar48;
                  auVar253._0_4_ = iVar60 + iVar48 >> auVar91;
                  auVar253._4_4_ = iVar69 + iVar48 >> auVar91;
                  auVar253._8_4_ = iVar234 + iVar48 >> auVar91;
                  auVar253._12_4_ = iVar320 + iVar48 >> auVar91;
                  in_XMM3._0_4_ = iVar340 + iVar48 >> auVar91;
                  in_XMM3._4_4_ = iVar321 + iVar48 >> auVar91;
                  in_XMM3._8_4_ = iVar341 + iVar48 >> auVar91;
                  in_XMM3._12_4_ = iVar322 + iVar48 >> auVar91;
                  auVar333 = packssdw(auVar253,in_XMM3);
                  sVar152 = auVar333._0_2_;
                  sVar155 = auVar333._2_2_;
                  sVar187 = auVar333._4_2_;
                  sVar10 = auVar333._6_2_;
                  uVar83 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                    CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                             (0xff < sVar187),
                                             CONCAT11((0 < sVar155) * (sVar155 < 0x100) *
                                                      auVar333[2] - (0xff < sVar155),
                                                      (0 < sVar152) * (sVar152 < 0x100) *
                                                      auVar333[0] - (0xff < sVar152))));
                  sVar11 = auVar333._8_2_;
                  sVar12 = auVar333._10_2_;
                  sVar13 = auVar333._12_2_;
                  sVar14 = auVar333._14_2_;
                  in_XMM4._0_8_ =
                       CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14),
                                CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] -
                                         (0xff < sVar13),
                                         CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar333[10] -
                                                  (0xff < sVar12),
                                                  CONCAT14((0 < sVar11) * (sVar11 < 0x100) *
                                                           auVar333[8] - (0xff < sVar11),uVar83))));
                  in_XMM4[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[0] - (0xff < sVar152);
                  in_XMM4[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[2] - (0xff < sVar155);
                  in_XMM4[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar333[4] - (0xff < sVar187);
                  in_XMM4[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10);
                  in_XMM4[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                  in_XMM4[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                  in_XMM4[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13);
                  in_XMM4[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14);
                  if (p_width == 4) {
                    *(undefined4 *)(pred + iVar78) = uVar83;
                  }
                  else {
                    *(undefined8 *)(pred + iVar78) = in_XMM4._0_8_;
                  }
                }
                else {
                  iVar70 = conv_params->dst_stride * iVar67 + iVar75;
                  auVar252._0_4_ = iVar60 + iVar48 >> auVar91;
                  auVar252._4_4_ = iVar69 + iVar48 >> auVar91;
                  auVar252._8_4_ = iVar234 + iVar48 >> auVar91;
                  auVar252._12_4_ = iVar320 + iVar48 >> auVar91;
                  in_XMM4 = packusdw(auVar252,auVar252);
                  if (conv_params->do_average == 0) {
                    *(long *)(conv_params->dst + iVar70) = in_XMM4._0_8_;
                  }
                  else {
                    uVar5 = *(ulong *)(conv_params->dst + iVar70);
                    sVar187 = (short)(uVar5 >> 0x30);
                    sVar155 = (short)(uVar5 >> 0x20);
                    auVar134._0_2_ = (short)uVar5;
                    sVar152 = (short)(uVar5 >> 0x10);
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar254._0_2_ = in_XMM4._0_2_ + auVar134._0_2_;
                      auVar254._2_2_ = in_XMM4._2_2_ + sVar152;
                      auVar254._4_2_ = in_XMM4._4_2_ + sVar155;
                      auVar254._6_2_ = in_XMM4._6_2_ + sVar187;
                      auVar254._8_2_ = in_XMM4._8_2_;
                      auVar254._10_2_ = in_XMM4._10_2_;
                      auVar254._12_2_ = in_XMM4._12_2_;
                      auVar254._14_2_ = in_XMM4._14_2_;
                      auVar84 = psraw(auVar254,1);
                      in_XMM4 = auVar84;
                    }
                    else {
                      auVar137._8_4_ = 0;
                      auVar137._0_8_ = uVar5;
                      auVar137._12_2_ = sVar187;
                      auVar137._14_2_ = in_XMM4._6_2_;
                      auVar136._12_4_ = auVar137._12_4_;
                      auVar136._8_2_ = 0;
                      auVar136._0_8_ = uVar5;
                      auVar136._10_2_ = in_XMM4._4_2_;
                      auVar135._10_6_ = auVar136._10_6_;
                      auVar135._8_2_ = sVar155;
                      auVar135._0_8_ = uVar5;
                      auVar134._8_8_ = auVar135._8_8_;
                      auVar134._6_2_ = in_XMM4._2_2_;
                      auVar134._4_2_ = sVar152;
                      auVar134._2_2_ = in_XMM4._0_2_;
                      auVar30._4_4_ = uVar82;
                      auVar30._0_4_ = uVar82;
                      auVar30._8_4_ = uVar82;
                      auVar30._12_4_ = uVar82;
                      auVar84 = pmaddwd(auVar134,auVar30);
                      auVar138._0_4_ = auVar84._0_4_ >> 4;
                      auVar138._4_4_ = auVar84._4_4_ >> 4;
                      auVar138._8_4_ = auVar84._8_4_ >> 4;
                      auVar138._12_4_ = auVar84._12_4_ >> 4;
                      auVar84 = packusdw(auVar138,auVar138);
                    }
                    auVar139._0_2_ = auVar84._0_2_ + local_2d8;
                    auVar139._2_2_ = auVar84._2_2_ + sStack_2d6;
                    auVar139._4_2_ = auVar84._4_2_ + local_2d8;
                    auVar139._6_2_ = auVar84._6_2_ + sStack_2d6;
                    auVar139._8_2_ = auVar84._8_2_ + local_2d8;
                    auVar139._10_2_ = auVar84._10_2_ + sStack_2d6;
                    auVar139._12_2_ = auVar84._12_2_ + local_2d8;
                    auVar139._14_2_ = auVar84._14_2_ + sStack_2d6;
                    auVar333 = psraw(auVar139,auVar92);
                    sVar152 = auVar333._0_2_;
                    sVar155 = auVar333._2_2_;
                    sVar187 = auVar333._4_2_;
                    sVar10 = auVar333._6_2_;
                    auVar84._0_4_ =
                         CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                  CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                           (0xff < sVar187),
                                           CONCAT11((0 < sVar155) * (sVar155 < 0x100) * auVar333[2]
                                                    - (0xff < sVar155),
                                                    (0 < sVar152) * (sVar152 < 0x100) * auVar333[0]
                                                    - (0xff < sVar152))));
                    sVar11 = auVar333._8_2_;
                    auVar84[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                    sVar12 = auVar333._10_2_;
                    auVar84[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                    sVar13 = auVar333._12_2_;
                    auVar84[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13);
                    sVar14 = auVar333._14_2_;
                    auVar84[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14);
                    auVar84[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[0] - (0xff < sVar152);
                    auVar84[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[2] - (0xff < sVar155);
                    auVar84[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar333[4] - (0xff < sVar187)
                    ;
                    auVar84[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10);
                    auVar84[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                    auVar84[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                    auVar84[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13)
                    ;
                    auVar84[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14)
                    ;
                    *(undefined4 *)(pred + iVar78) = auVar84._0_4_;
                  }
                  if (4 < p_width) {
                    auVar224._0_4_ = iVar340 + iVar48 >> auVar91;
                    auVar224._4_4_ = iVar321 + iVar48 >> auVar91;
                    auVar224._8_4_ = iVar341 + iVar48 >> auVar91;
                    auVar224._12_4_ = iVar322 + iVar48 >> auVar91;
                    lVar53 = (long)(conv_params->dst_stride * iVar67 + iVar75);
                    in_XMM3 = packusdw(auVar224,auVar224);
                    if (conv_params->do_average == 0) {
                      *(long *)(conv_params->dst + lVar53 + 4) = in_XMM3._0_8_;
                    }
                    else {
                      uVar5 = *(ulong *)(conv_params->dst + lVar53 + 4);
                      sVar187 = (short)(uVar5 >> 0x30);
                      sVar155 = (short)(uVar5 >> 0x20);
                      auVar140._0_2_ = (short)uVar5;
                      sVar152 = (short)(uVar5 >> 0x10);
                      if (conv_params->use_dist_wtd_comp_avg == 0) {
                        auVar225._0_2_ = in_XMM3._0_2_ + auVar140._0_2_;
                        auVar225._2_2_ = in_XMM3._2_2_ + sVar152;
                        auVar225._4_2_ = in_XMM3._4_2_ + sVar155;
                        auVar225._6_2_ = in_XMM3._6_2_ + sVar187;
                        auVar225._8_2_ = in_XMM3._8_2_;
                        auVar225._10_2_ = in_XMM3._10_2_;
                        auVar225._12_2_ = in_XMM3._12_2_;
                        auVar225._14_2_ = in_XMM3._14_2_;
                        auVar84 = psraw(auVar225,1);
                        in_XMM3 = auVar84;
                      }
                      else {
                        auVar143._8_4_ = 0;
                        auVar143._0_8_ = uVar5;
                        auVar143._12_2_ = sVar187;
                        auVar143._14_2_ = in_XMM3._6_2_;
                        auVar142._12_4_ = auVar143._12_4_;
                        auVar142._8_2_ = 0;
                        auVar142._0_8_ = uVar5;
                        auVar142._10_2_ = in_XMM3._4_2_;
                        auVar141._10_6_ = auVar142._10_6_;
                        auVar141._8_2_ = sVar155;
                        auVar141._0_8_ = uVar5;
                        auVar140._8_8_ = auVar141._8_8_;
                        auVar140._6_2_ = in_XMM3._2_2_;
                        auVar140._4_2_ = sVar152;
                        auVar140._2_2_ = in_XMM3._0_2_;
                        auVar31._4_4_ = uVar82;
                        auVar31._0_4_ = uVar82;
                        auVar31._8_4_ = uVar82;
                        auVar31._12_4_ = uVar82;
                        auVar84 = pmaddwd(auVar140,auVar31);
                        auVar144._0_4_ = auVar84._0_4_ >> 4;
                        auVar144._4_4_ = auVar84._4_4_ >> 4;
                        auVar144._8_4_ = auVar84._8_4_ >> 4;
                        auVar144._12_4_ = auVar84._12_4_ >> 4;
                        auVar84 = packusdw(auVar144,auVar144);
                      }
                      auVar145._0_2_ = auVar84._0_2_ + local_2d8;
                      auVar145._2_2_ = auVar84._2_2_ + sStack_2d6;
                      auVar145._4_2_ = auVar84._4_2_ + local_2d8;
                      auVar145._6_2_ = auVar84._6_2_ + sStack_2d6;
                      auVar145._8_2_ = auVar84._8_2_ + local_2d8;
                      auVar145._10_2_ = auVar84._10_2_ + sStack_2d6;
                      auVar145._12_2_ = auVar84._12_2_ + local_2d8;
                      auVar145._14_2_ = auVar84._14_2_ + sStack_2d6;
                      auVar333 = psraw(auVar145,auVar92);
                      sVar152 = auVar333._0_2_;
                      sVar155 = auVar333._2_2_;
                      sVar187 = auVar333._4_2_;
                      sVar10 = auVar333._6_2_;
                      auVar84._0_4_ =
                           CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                    CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                             (0xff < sVar187),
                                             CONCAT11((0 < sVar155) * (sVar155 < 0x100) *
                                                      auVar333[2] - (0xff < sVar155),
                                                      (0 < sVar152) * (sVar152 < 0x100) *
                                                      auVar333[0] - (0xff < sVar152))));
                      sVar11 = auVar333._8_2_;
                      auVar84[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                      sVar12 = auVar333._10_2_;
                      auVar84[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                      sVar13 = auVar333._12_2_;
                      auVar84[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13)
                      ;
                      sVar14 = auVar333._14_2_;
                      auVar84[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14)
                      ;
                      auVar84[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[0] -
                                   (0xff < sVar152);
                      auVar84[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[2] -
                                   (0xff < sVar155);
                      auVar84[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                    (0xff < sVar187);
                      auVar84[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10)
                      ;
                      auVar84[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11)
                      ;
                      auVar84[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] -
                                     (0xff < sVar12);
                      auVar84[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] -
                                     (0xff < sVar13);
                      auVar84[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] -
                                     (0xff < sVar14);
                      *(undefined4 *)(pred + (long)iVar78 + 4) = auVar84._0_4_;
                    }
                  }
                }
                iVar78 = iVar78 + p_stride;
                iVar67 = iVar67 + 1;
                puVar54 = puVar54 + 8;
                iVar50 = iVar50 + iVar76;
                uVar81 = uVar81 - 1;
              } while (uVar81 != 0);
            }
          }
          else if (0 < iVar65) {
            bVar16 = local_32c - (char)*local_2e8;
            auVar84 = ZEXT416((-1 << (bVar16 & 0x1f)) + uVar49 + (-1 << (bVar16 - 1 & 0x1f)));
            auVar84 = pshuflw(auVar84,auVar84,0);
            local_2d8 = auVar84._0_2_;
            sStack_2d6 = auVar84._2_2_;
            pauVar58 = (undefined1 (*) [16])local_b8;
            uVar81 = uVar62;
            iVar78 = local_328;
            iVar67 = iVar61;
            do {
              iVar60 = iVar50 >> 10;
              uVar83 = *(undefined4 *)av1_warped_filter[iVar60];
              uVar18 = *(undefined4 *)(av1_warped_filter[iVar60] + 2);
              uVar19 = *(undefined4 *)(av1_warped_filter[iVar60] + 4);
              uVar20 = *(undefined4 *)(av1_warped_filter[iVar60] + 6);
              auVar323._4_4_ = uVar83;
              auVar323._0_4_ = uVar83;
              auVar323._8_4_ = uVar83;
              auVar323._12_4_ = uVar83;
              auVar315._4_4_ = uVar18;
              auVar315._0_4_ = uVar18;
              auVar315._8_4_ = uVar18;
              auVar315._12_4_ = uVar18;
              auVar311._4_4_ = uVar19;
              auVar311._0_4_ = uVar19;
              auVar311._8_4_ = uVar19;
              auVar311._12_4_ = uVar19;
              in_XMM4._4_4_ = uVar20;
              in_XMM4._0_4_ = uVar20;
              in_XMM4._8_4_ = uVar20;
              in_XMM4._12_4_ = uVar20;
              auVar84 = pauVar58[-7];
              auVar333 = pauVar58[-5];
              auVar192._0_12_ = auVar84._0_12_;
              auVar192._12_2_ = auVar84._6_2_;
              auVar192._14_2_ = *(undefined2 *)(pauVar58[-6] + 6);
              auVar191._12_4_ = auVar192._12_4_;
              auVar191._0_10_ = auVar84._0_10_;
              auVar191._10_2_ = *(undefined2 *)(pauVar58[-6] + 4);
              auVar190._10_6_ = auVar191._10_6_;
              auVar190._0_8_ = auVar84._0_8_;
              auVar190._8_2_ = auVar84._4_2_;
              auVar189._8_8_ = auVar190._8_8_;
              auVar189._6_2_ = *(undefined2 *)(pauVar58[-6] + 2);
              auVar189._4_2_ = auVar84._2_2_;
              auVar189._0_2_ = auVar84._0_2_;
              auVar189._2_2_ = *(undefined2 *)pauVar58[-6];
              auVar280._0_12_ = auVar333._0_12_;
              auVar280._12_2_ = auVar333._6_2_;
              auVar280._14_2_ = *(undefined2 *)(pauVar58[-4] + 6);
              auVar279._12_4_ = auVar280._12_4_;
              auVar279._0_10_ = auVar333._0_10_;
              auVar279._10_2_ = *(undefined2 *)(pauVar58[-4] + 4);
              auVar278._10_6_ = auVar279._10_6_;
              auVar278._0_8_ = auVar333._0_8_;
              auVar278._8_2_ = auVar333._4_2_;
              auVar277._8_8_ = auVar278._8_8_;
              auVar277._6_2_ = *(undefined2 *)(pauVar58[-4] + 2);
              auVar277._4_2_ = auVar333._2_2_;
              auVar277._0_2_ = auVar333._0_2_;
              auVar277._2_2_ = *(undefined2 *)pauVar58[-4];
              auVar336 = pauVar58[-3];
              auVar354._0_12_ = auVar336._0_12_;
              auVar354._12_2_ = auVar336._6_2_;
              auVar354._14_2_ = *(undefined2 *)(pauVar58[-2] + 6);
              auVar353._12_4_ = auVar354._12_4_;
              auVar353._0_10_ = auVar336._0_10_;
              auVar353._10_2_ = *(undefined2 *)(pauVar58[-2] + 4);
              auVar352._10_6_ = auVar353._10_6_;
              auVar352._0_8_ = auVar336._0_8_;
              auVar352._8_2_ = auVar336._4_2_;
              auVar351._8_8_ = auVar352._8_8_;
              auVar351._6_2_ = *(undefined2 *)(pauVar58[-2] + 2);
              auVar351._4_2_ = auVar336._2_2_;
              auVar351._0_2_ = auVar336._0_2_;
              auVar351._2_2_ = *(undefined2 *)pauVar58[-2];
              auVar343 = pauVar58[-1];
              in_XMM5 = *pauVar58;
              auVar193 = pmaddwd(auVar189,auVar323);
              auVar281 = pmaddwd(auVar277,auVar315);
              auVar197._0_12_ = auVar343._0_12_;
              auVar197._12_2_ = auVar343._6_2_;
              auVar197._14_2_ = in_XMM5._6_2_;
              auVar196._12_4_ = auVar197._12_4_;
              auVar196._0_10_ = auVar343._0_10_;
              auVar196._10_2_ = in_XMM5._4_2_;
              auVar195._10_6_ = auVar196._10_6_;
              auVar195._0_8_ = auVar343._0_8_;
              auVar195._8_2_ = auVar343._4_2_;
              auVar194._8_8_ = auVar195._8_8_;
              auVar194._6_2_ = in_XMM5._2_2_;
              auVar194._4_2_ = auVar343._2_2_;
              auVar194._0_2_ = auVar343._0_2_;
              auVar194._2_2_ = in_XMM5._0_2_;
              auVar355 = pmaddwd(auVar351,auVar311);
              auVar198 = pmaddwd(auVar194,in_XMM4);
              iVar60 = auVar198._8_4_ + auVar355._8_4_ + auVar281._8_4_ + auVar193._8_4_;
              iVar234 = auVar198._12_4_ + auVar355._12_4_ + auVar281._12_4_ + auVar193._12_4_;
              auVar332._2_2_ = *(undefined2 *)(pauVar58[-6] + 8);
              auVar332._0_2_ = auVar84._8_2_;
              auVar332._4_2_ = auVar84._10_2_;
              auVar332._6_2_ = *(undefined2 *)(pauVar58[-6] + 10);
              auVar332._8_2_ = auVar84._12_2_;
              auVar332._10_2_ = *(undefined2 *)(pauVar58[-6] + 0xc);
              auVar332._12_2_ = auVar84._14_2_;
              auVar332._14_2_ = *(undefined2 *)(pauVar58[-6] + 0xe);
              auVar93._2_2_ = *(undefined2 *)(pauVar58[-4] + 8);
              auVar93._0_2_ = auVar333._8_2_;
              auVar93._4_2_ = auVar333._10_2_;
              auVar93._6_2_ = *(undefined2 *)(pauVar58[-4] + 10);
              auVar93._8_2_ = auVar333._12_2_;
              auVar93._10_2_ = *(undefined2 *)(pauVar58[-4] + 0xc);
              auVar93._12_2_ = auVar333._14_2_;
              auVar93._14_2_ = *(undefined2 *)(pauVar58[-4] + 0xe);
              auVar342._2_2_ = *(undefined2 *)(pauVar58[-2] + 8);
              auVar342._0_2_ = auVar336._8_2_;
              auVar342._4_2_ = auVar336._10_2_;
              auVar342._6_2_ = *(undefined2 *)(pauVar58[-2] + 10);
              auVar342._8_2_ = auVar336._12_2_;
              auVar342._10_2_ = *(undefined2 *)(pauVar58[-2] + 0xc);
              auVar342._12_2_ = auVar336._14_2_;
              auVar342._14_2_ = *(undefined2 *)(pauVar58[-2] + 0xe);
              auVar335._2_2_ = in_XMM5._8_2_;
              auVar335._0_2_ = auVar343._8_2_;
              auVar335._4_2_ = auVar343._10_2_;
              auVar335._6_2_ = in_XMM5._10_2_;
              auVar335._8_2_ = auVar343._12_2_;
              auVar335._10_2_ = in_XMM5._12_2_;
              auVar335._12_2_ = auVar343._14_2_;
              auVar335._14_2_ = in_XMM5._14_2_;
              auVar333 = pmaddwd(auVar332,auVar323);
              auVar84 = pmaddwd(auVar93,auVar315);
              auVar343 = pmaddwd(auVar342,auVar311);
              auVar336 = pmaddwd(auVar335,in_XMM4);
              iVar340 = auVar336._8_4_ + auVar343._8_4_ + auVar84._8_4_ + auVar333._8_4_;
              iVar341 = auVar336._12_4_ + auVar343._12_4_ + auVar84._12_4_ + auVar333._12_4_;
              in_XMM3._4_4_ = iVar340;
              in_XMM3._0_4_ = iVar60;
              in_XMM3._8_4_ = iVar234;
              in_XMM3._12_4_ = iVar341;
              auVar94._0_4_ =
                   auVar198._0_4_ + auVar355._0_4_ + auVar281._0_4_ + auVar193._0_4_ + iVar48 >>
                   auVar91;
              auVar94._4_4_ =
                   auVar336._0_4_ + auVar343._0_4_ + auVar84._0_4_ + auVar333._0_4_ + iVar48 >>
                   auVar91;
              auVar94._8_4_ =
                   auVar198._4_4_ + auVar355._4_4_ + auVar281._4_4_ + auVar193._4_4_ + iVar48 >>
                   auVar91;
              auVar94._12_4_ =
                   auVar336._4_4_ + auVar343._4_4_ + auVar84._4_4_ + auVar333._4_4_ + iVar48 >>
                   auVar91;
              if (conv_params->is_compound == 0) {
                auVar95._4_4_ = auVar94._4_4_;
                auVar95._0_4_ = auVar94._0_4_;
                auVar95._8_4_ = auVar94._8_4_;
                auVar95._12_4_ = auVar94._12_4_;
                in_XMM3._0_4_ = iVar60 + iVar48 >> auVar91;
                in_XMM3._4_4_ = iVar340 + iVar48 >> auVar91;
                in_XMM3._8_4_ = iVar234 + iVar48 >> auVar91;
                in_XMM3._12_4_ = iVar341 + iVar48 >> auVar91;
                auVar333 = packssdw(auVar95,in_XMM3);
                sVar152 = auVar333._0_2_;
                sVar155 = auVar333._2_2_;
                sVar187 = auVar333._4_2_;
                sVar10 = auVar333._6_2_;
                uVar83 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                  CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                           (0xff < sVar187),
                                           CONCAT11((0 < sVar155) * (sVar155 < 0x100) * auVar333[2]
                                                    - (0xff < sVar155),
                                                    (0 < sVar152) * (sVar152 < 0x100) * auVar333[0]
                                                    - (0xff < sVar152))));
                sVar11 = auVar333._8_2_;
                sVar12 = auVar333._10_2_;
                sVar13 = auVar333._12_2_;
                sVar14 = auVar333._14_2_;
                auVar84._0_8_ =
                     CONCAT17((0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14),
                              CONCAT16((0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] -
                                       (0xff < sVar13),
                                       CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar333[10] -
                                                (0xff < sVar12),
                                                CONCAT14((0 < sVar11) * (sVar11 < 0x100) *
                                                         auVar333[8] - (0xff < sVar11),uVar83))));
                auVar84[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[0] - (0xff < sVar152);
                auVar84[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[2] - (0xff < sVar155);
                auVar84[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar333[4] - (0xff < sVar187);
                auVar84[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10);
                auVar84[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                auVar84[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                auVar84[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13);
                auVar84[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14);
                if (p_width == 4) {
                  *(undefined4 *)(pred + iVar78) = uVar83;
                }
                else {
                  *(undefined8 *)(pred + iVar78) = auVar84._0_8_;
                }
              }
              else {
                iVar69 = conv_params->dst_stride * iVar67 + iVar75;
                auVar84 = packusdw(auVar94,auVar94);
                if (conv_params->do_average == 0) {
                  *(long *)(conv_params->dst + iVar69) = auVar84._0_8_;
                }
                else {
                  uVar5 = *(ulong *)(conv_params->dst + iVar69);
                  sVar187 = (short)(uVar5 >> 0x30);
                  sVar155 = (short)(uVar5 >> 0x20);
                  auVar161._0_2_ = (short)uVar5;
                  sVar152 = (short)(uVar5 >> 0x10);
                  if (conv_params->use_dist_wtd_comp_avg == 0) {
                    auVar96._0_2_ = auVar84._0_2_ + auVar161._0_2_;
                    auVar96._2_2_ = auVar84._2_2_ + sVar152;
                    auVar96._4_2_ = auVar84._4_2_ + sVar155;
                    auVar96._6_2_ = auVar84._6_2_ + sVar187;
                    auVar96._8_2_ = auVar84._8_2_;
                    auVar96._10_2_ = auVar84._10_2_;
                    auVar96._12_2_ = auVar84._12_2_;
                    auVar96._14_2_ = auVar84._14_2_;
                    auVar84 = psraw(auVar96,1);
                    auVar333 = auVar84;
                  }
                  else {
                    auVar164._8_4_ = 0;
                    auVar164._0_8_ = uVar5;
                    auVar164._12_2_ = sVar187;
                    auVar164._14_2_ = auVar84._6_2_;
                    auVar163._12_4_ = auVar164._12_4_;
                    auVar163._8_2_ = 0;
                    auVar163._0_8_ = uVar5;
                    auVar163._10_2_ = auVar84._4_2_;
                    auVar162._10_6_ = auVar163._10_6_;
                    auVar162._8_2_ = sVar155;
                    auVar162._0_8_ = uVar5;
                    auVar161._8_8_ = auVar162._8_8_;
                    auVar161._6_2_ = auVar84._2_2_;
                    auVar161._4_2_ = sVar152;
                    auVar161._2_2_ = auVar84._0_2_;
                    auVar24._4_4_ = uVar82;
                    auVar24._0_4_ = uVar82;
                    auVar24._8_4_ = uVar82;
                    auVar24._12_4_ = uVar82;
                    auVar333 = pmaddwd(auVar161,auVar24);
                    auVar165._0_4_ = auVar333._0_4_ >> 4;
                    auVar165._4_4_ = auVar333._4_4_ >> 4;
                    auVar165._8_4_ = auVar333._8_4_ >> 4;
                    auVar165._12_4_ = auVar333._12_4_ >> 4;
                    auVar333 = packusdw(auVar165,auVar165);
                  }
                  auVar166._0_2_ = auVar333._0_2_ + local_2d8;
                  auVar166._2_2_ = auVar333._2_2_ + sStack_2d6;
                  auVar166._4_2_ = auVar333._4_2_ + local_2d8;
                  auVar166._6_2_ = auVar333._6_2_ + sStack_2d6;
                  auVar166._8_2_ = auVar333._8_2_ + local_2d8;
                  auVar166._10_2_ = auVar333._10_2_ + sStack_2d6;
                  auVar166._12_2_ = auVar333._12_2_ + local_2d8;
                  auVar166._14_2_ = auVar333._14_2_ + sStack_2d6;
                  auVar333 = psraw(auVar166,auVar92);
                  sVar152 = auVar333._0_2_;
                  sVar155 = auVar333._2_2_;
                  sVar187 = auVar333._4_2_;
                  sVar10 = auVar333._6_2_;
                  *(uint *)(pred + iVar78) =
                       CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                         (0xff < sVar187),
                                         CONCAT11((0 < sVar155) * (sVar155 < 0x100) * auVar333[2] -
                                                  (0xff < sVar155),
                                                  (0 < sVar152) * (sVar152 < 0x100) * auVar333[0] -
                                                  (0xff < sVar152))));
                }
                if (4 < p_width) {
                  auVar199._0_4_ = iVar60 + iVar48 >> auVar91;
                  auVar199._4_4_ = iVar340 + iVar48 >> auVar91;
                  auVar199._8_4_ = iVar234 + iVar48 >> auVar91;
                  auVar199._12_4_ = iVar341 + iVar48 >> auVar91;
                  lVar53 = (long)(conv_params->dst_stride * iVar67 + iVar75);
                  in_XMM3 = packusdw(auVar199,auVar199);
                  if (conv_params->do_average == 0) {
                    *(long *)(conv_params->dst + lVar53 + 4) = in_XMM3._0_8_;
                  }
                  else {
                    uVar5 = *(ulong *)(conv_params->dst + lVar53 + 4);
                    sVar187 = (short)(uVar5 >> 0x30);
                    sVar155 = (short)(uVar5 >> 0x20);
                    auVar97._0_2_ = (short)uVar5;
                    sVar152 = (short)(uVar5 >> 0x10);
                    if (conv_params->use_dist_wtd_comp_avg == 0) {
                      auVar200._0_2_ = in_XMM3._0_2_ + auVar97._0_2_;
                      auVar200._2_2_ = in_XMM3._2_2_ + sVar152;
                      auVar200._4_2_ = in_XMM3._4_2_ + sVar155;
                      auVar200._6_2_ = in_XMM3._6_2_ + sVar187;
                      auVar200._8_2_ = in_XMM3._8_2_;
                      auVar200._10_2_ = in_XMM3._10_2_;
                      auVar200._12_2_ = in_XMM3._12_2_;
                      auVar200._14_2_ = in_XMM3._14_2_;
                      auVar84 = psraw(auVar200,1);
                      in_XMM3 = auVar84;
                    }
                    else {
                      auVar100._8_4_ = 0;
                      auVar100._0_8_ = uVar5;
                      auVar100._12_2_ = sVar187;
                      auVar100._14_2_ = in_XMM3._6_2_;
                      auVar99._12_4_ = auVar100._12_4_;
                      auVar99._8_2_ = 0;
                      auVar99._0_8_ = uVar5;
                      auVar99._10_2_ = in_XMM3._4_2_;
                      auVar98._10_6_ = auVar99._10_6_;
                      auVar98._8_2_ = sVar155;
                      auVar98._0_8_ = uVar5;
                      auVar97._8_8_ = auVar98._8_8_;
                      auVar97._6_2_ = in_XMM3._2_2_;
                      auVar97._4_2_ = sVar152;
                      auVar97._2_2_ = in_XMM3._0_2_;
                      auVar25._4_4_ = uVar82;
                      auVar25._0_4_ = uVar82;
                      auVar25._8_4_ = uVar82;
                      auVar25._12_4_ = uVar82;
                      auVar84 = pmaddwd(auVar97,auVar25);
                      auVar101._0_4_ = auVar84._0_4_ >> 4;
                      auVar101._4_4_ = auVar84._4_4_ >> 4;
                      auVar101._8_4_ = auVar84._8_4_ >> 4;
                      auVar101._12_4_ = auVar84._12_4_ >> 4;
                      auVar84 = packusdw(auVar101,auVar101);
                    }
                    auVar102._0_2_ = auVar84._0_2_ + local_2d8;
                    auVar102._2_2_ = auVar84._2_2_ + sStack_2d6;
                    auVar102._4_2_ = auVar84._4_2_ + local_2d8;
                    auVar102._6_2_ = auVar84._6_2_ + sStack_2d6;
                    auVar102._8_2_ = auVar84._8_2_ + local_2d8;
                    auVar102._10_2_ = auVar84._10_2_ + sStack_2d6;
                    auVar102._12_2_ = auVar84._12_2_ + local_2d8;
                    auVar102._14_2_ = auVar84._14_2_ + sStack_2d6;
                    auVar333 = psraw(auVar102,auVar92);
                    sVar152 = auVar333._0_2_;
                    sVar155 = auVar333._2_2_;
                    sVar187 = auVar333._4_2_;
                    sVar10 = auVar333._6_2_;
                    auVar84._0_4_ =
                         CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10),
                                  CONCAT12((0 < sVar187) * (sVar187 < 0x100) * auVar333[4] -
                                           (0xff < sVar187),
                                           CONCAT11((0 < sVar155) * (sVar155 < 0x100) * auVar333[2]
                                                    - (0xff < sVar155),
                                                    (0 < sVar152) * (sVar152 < 0x100) * auVar333[0]
                                                    - (0xff < sVar152))));
                    sVar11 = auVar333._8_2_;
                    auVar84[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                    sVar12 = auVar333._10_2_;
                    auVar84[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                    sVar13 = auVar333._12_2_;
                    auVar84[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13);
                    sVar14 = auVar333._14_2_;
                    auVar84[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14);
                    auVar84[8] = (0 < sVar152) * (sVar152 < 0x100) * auVar333[0] - (0xff < sVar152);
                    auVar84[9] = (0 < sVar155) * (sVar155 < 0x100) * auVar333[2] - (0xff < sVar155);
                    auVar84[10] = (0 < sVar187) * (sVar187 < 0x100) * auVar333[4] - (0xff < sVar187)
                    ;
                    auVar84[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar333[6] - (0xff < sVar10);
                    auVar84[0xc] = (0 < sVar11) * (sVar11 < 0x100) * auVar333[8] - (0xff < sVar11);
                    auVar84[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar333[10] - (0xff < sVar12);
                    auVar84[0xe] = (0 < sVar13) * (sVar13 < 0x100) * auVar333[0xc] - (0xff < sVar13)
                    ;
                    auVar84[0xf] = (0 < sVar14) * (sVar14 < 0x100) * auVar333[0xe] - (0xff < sVar14)
                    ;
                    *(undefined4 *)(pred + (long)iVar78 + 4) = auVar84._0_4_;
                  }
                }
              }
              iVar78 = iVar78 + p_stride;
              iVar67 = iVar67 + 1;
              pauVar58 = pauVar58 + 1;
              iVar50 = iVar50 + iVar76;
              uVar81 = uVar81 - 1;
            } while (uVar81 != 0);
          }
          iVar75 = iVar75 + 8;
          local_328 = local_328 + 8;
          auVar91 = _DAT_00563870;
          auVar92 = _DAT_00563880;
        } while (iVar75 < p_width);
      }
      iVar61 = iVar61 + 8;
      uVar56 = uVar56 - 8;
      local_314 = local_314 + p_stride * 8;
    } while (iVar61 < p_height);
  }
  return;
}

Assistant:

void av1_warp_affine_sse4_1(const int32_t *mat, const uint8_t *ref, int width,
                            int height, int stride, uint8_t *pred, int p_col,
                            int p_row, int p_width, int p_height, int p_stride,
                            int subsampling_x, int subsampling_y,
                            ConvolveParams *conv_params, int16_t alpha,
                            int16_t beta, int16_t gamma, int16_t delta) {
  __m128i tmp[15];
  int i, j, k;
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m128i reduce_bits_vert_const =
      _mm_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m128i res_add_const = _mm_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  /* Note: For this code to work, the left/right frame borders need to be
  extended by at least 13 pixels each. By the time we get here, other
  code will have set up this border, but we allow an explicit check
  for debugging purposes.
  */
  /*for (i = 0; i < height; ++i) {
  for (j = 0; j < 13; ++j) {
  assert(ref[i * stride - 13 + j] == ref[i * stride]);
  assert(ref[i * stride + width + j] == ref[i * stride + (width - 1)]);
  }
  }*/
  __m128i res_add_const_1;
  if (conv_params->is_compound == 1) {
    res_add_const_1 = _mm_add_epi32(reduce_bits_vert_const, res_add_const);
  } else {
    res_add_const_1 = _mm_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                     ((1 << reduce_bits_vert) >> 1));
  }

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += alpha * (-4) + beta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
      sy4 += gamma * (-4) + delta * (-4) + (1 << (WARPEDDIFF_PREC_BITS - 1)) +
             (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.
      if (ix4 <= -7) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] = _mm_set1_epi16(
              (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
              ref[iy * stride] * (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (ix4 >= width + 6) {
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          tmp[k + 7] =
              _mm_set1_epi16((1 << (bd + FILTER_BITS - reduce_bits_horiz - 1)) +
                             ref[iy * stride + (width - 1)] *
                                 (1 << (FILTER_BITS - reduce_bits_horiz)));
        }
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;
        for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
          int iy = iy4 + k;
          if (iy < 0)
            iy = 0;
          else if (iy > height - 1)
            iy = height - 1;
          int sx = sx4 + beta * (k + 4);

          // Load source pixels
          __m128i src =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src = _mm_shuffle_epi8(src, shuffle_reg_left);
          }
          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src = _mm_shuffle_epi8(src, shuffle_reg_right);
          }
          horizontal_filter(src, tmp, sx, alpha, k, offset_bits_horiz,
                            reduce_bits_horiz);
        }
      } else {
        prepare_warp_horizontal_filter(ref, tmp, stride, ix4, iy4, sx4, alpha,
                                       beta, p_height, height, i,
                                       offset_bits_horiz, reduce_bits_horiz);
      }

      // Vertical filter
      prepare_warp_vertical_filter(
          pred, tmp, conv_params, gamma, delta, p_height, p_stride, p_width, i,
          j, sy4, reduce_bits_vert, &res_add_const_1, round_bits, offset_bits);
    }
  }
}